

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<8,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  long lVar19;
  long lVar20;
  RTCFilterFunctionN p_Var21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined8 uVar36;
  ulong uVar37;
  uint uVar38;
  long lVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  byte bVar106;
  byte bVar107;
  ulong uVar108;
  uint uVar109;
  ulong uVar110;
  long lVar111;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar112;
  long lVar113;
  byte bVar114;
  float fVar115;
  float fVar116;
  float fVar164;
  float fVar165;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar121 [16];
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar167;
  float fVar170;
  float fVar171;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  float fVar172;
  undefined4 uVar173;
  undefined8 uVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar206;
  float fVar211;
  float fVar212;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined4 uVar234;
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  undefined8 local_960;
  undefined8 uStack_958;
  RTCFilterFunctionNArguments local_948;
  undefined1 (*local_918) [32];
  undefined1 local_910 [16];
  uint local_900;
  undefined4 uStack_8fc;
  undefined8 uStack_8f8;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [8];
  undefined8 uStack_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  float local_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined8 uStack_818;
  LinearSpace3fa *local_808;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined4 local_640;
  int local_63c;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  byte local_5f0;
  float local_5e0 [4];
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [64];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar13 = prim[1];
  uVar108 = (ulong)(byte)PVar13;
  lVar39 = uVar108 * 0x25;
  fVar206 = *(float *)(prim + lVar39 + 0x12);
  auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar117 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar175 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar119 = vsubps_avx(auVar117,*(undefined1 (*) [16])(prim + lVar39 + 6));
  fVar197 = fVar206 * auVar119._0_4_;
  fVar172 = fVar206 * auVar175._0_4_;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar108 * 4 + 6);
  auVar126 = vpmovsxbd_avx2(auVar117);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar108 * 5 + 6);
  auVar125 = vpmovsxbd_avx2(auVar118);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar108 * 6 + 6);
  auVar137 = vpmovsxbd_avx2(auVar243);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar108 * 0xf + 6);
  auVar136 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar130 = vpmovsxbd_avx2(auVar8);
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar127 = vcvtdq2ps_avx(auVar130);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar108 + 6);
  auVar128 = vpmovsxbd_avx2(auVar9);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar108 * 0x1a + 6);
  auVar135 = vpmovsxbd_avx2(auVar10);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar108 * 0x1b + 6);
  auVar129 = vpmovsxbd_avx2(auVar11);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar108 * 0x1c + 6);
  auVar124 = vpmovsxbd_avx2(auVar12);
  auVar131 = vcvtdq2ps_avx(auVar124);
  auVar217._4_4_ = fVar172;
  auVar217._0_4_ = fVar172;
  auVar217._8_4_ = fVar172;
  auVar217._12_4_ = fVar172;
  auVar217._16_4_ = fVar172;
  auVar217._20_4_ = fVar172;
  auVar217._24_4_ = fVar172;
  auVar217._28_4_ = fVar172;
  auVar238._8_4_ = 1;
  auVar238._0_8_ = 0x100000001;
  auVar238._12_4_ = 1;
  auVar238._16_4_ = 1;
  auVar238._20_4_ = 1;
  auVar238._24_4_ = 1;
  auVar238._28_4_ = 1;
  auVar122 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar133 = ZEXT1632(CONCAT412(fVar206 * auVar175._12_4_,
                                CONCAT48(fVar206 * auVar175._8_4_,
                                         CONCAT44(fVar206 * auVar175._4_4_,fVar172))));
  auVar132 = vpermps_avx2(auVar238,auVar133);
  auVar123 = vpermps_avx512vl(auVar122,auVar133);
  fVar211 = auVar123._0_4_;
  fVar212 = auVar123._4_4_;
  auVar133._4_4_ = fVar212 * auVar137._4_4_;
  auVar133._0_4_ = fVar211 * auVar137._0_4_;
  fVar198 = auVar123._8_4_;
  auVar133._8_4_ = fVar198 * auVar137._8_4_;
  fVar205 = auVar123._12_4_;
  auVar133._12_4_ = fVar205 * auVar137._12_4_;
  fVar115 = auVar123._16_4_;
  auVar133._16_4_ = fVar115 * auVar137._16_4_;
  fVar116 = auVar123._20_4_;
  auVar133._20_4_ = fVar116 * auVar137._20_4_;
  fVar164 = auVar123._24_4_;
  auVar133._24_4_ = fVar164 * auVar137._24_4_;
  auVar133._28_4_ = auVar130._28_4_;
  auVar130._4_4_ = auVar128._4_4_ * fVar212;
  auVar130._0_4_ = auVar128._0_4_ * fVar211;
  auVar130._8_4_ = auVar128._8_4_ * fVar198;
  auVar130._12_4_ = auVar128._12_4_ * fVar205;
  auVar130._16_4_ = auVar128._16_4_ * fVar115;
  auVar130._20_4_ = auVar128._20_4_ * fVar116;
  auVar130._24_4_ = auVar128._24_4_ * fVar164;
  auVar130._28_4_ = auVar124._28_4_;
  auVar124._4_4_ = auVar131._4_4_ * fVar212;
  auVar124._0_4_ = auVar131._0_4_ * fVar211;
  auVar124._8_4_ = auVar131._8_4_ * fVar198;
  auVar124._12_4_ = auVar131._12_4_ * fVar205;
  auVar124._16_4_ = auVar131._16_4_ * fVar115;
  auVar124._20_4_ = auVar131._20_4_ * fVar116;
  auVar124._24_4_ = auVar131._24_4_ * fVar164;
  auVar124._28_4_ = auVar123._28_4_;
  auVar117 = vfmadd231ps_fma(auVar133,auVar132,auVar125);
  auVar118 = vfmadd231ps_fma(auVar130,auVar132,auVar127);
  auVar243 = vfmadd231ps_fma(auVar124,auVar129,auVar132);
  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar217,auVar126);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar217,auVar136);
  auVar243 = vfmadd231ps_fma(ZEXT1632(auVar243),auVar135,auVar217);
  auVar235._4_4_ = fVar197;
  auVar235._0_4_ = fVar197;
  auVar235._8_4_ = fVar197;
  auVar235._12_4_ = fVar197;
  auVar235._16_4_ = fVar197;
  auVar235._20_4_ = fVar197;
  auVar235._24_4_ = fVar197;
  auVar235._28_4_ = fVar197;
  auVar124 = ZEXT1632(CONCAT412(fVar206 * auVar119._12_4_,
                                CONCAT48(fVar206 * auVar119._8_4_,
                                         CONCAT44(fVar206 * auVar119._4_4_,fVar197))));
  auVar130 = vpermps_avx2(auVar238,auVar124);
  auVar124 = vpermps_avx512vl(auVar122,auVar124);
  fVar206 = auVar124._0_4_;
  fVar211 = auVar124._4_4_;
  auVar132._4_4_ = fVar211 * auVar137._4_4_;
  auVar132._0_4_ = fVar206 * auVar137._0_4_;
  fVar212 = auVar124._8_4_;
  auVar132._8_4_ = fVar212 * auVar137._8_4_;
  fVar198 = auVar124._12_4_;
  auVar132._12_4_ = fVar198 * auVar137._12_4_;
  fVar205 = auVar124._16_4_;
  auVar132._16_4_ = fVar205 * auVar137._16_4_;
  fVar115 = auVar124._20_4_;
  auVar132._20_4_ = fVar115 * auVar137._20_4_;
  fVar116 = auVar124._24_4_;
  auVar132._24_4_ = fVar116 * auVar137._24_4_;
  auVar132._28_4_ = fVar172;
  auVar122._4_4_ = auVar128._4_4_ * fVar211;
  auVar122._0_4_ = auVar128._0_4_ * fVar206;
  auVar122._8_4_ = auVar128._8_4_ * fVar212;
  auVar122._12_4_ = auVar128._12_4_ * fVar198;
  auVar122._16_4_ = auVar128._16_4_ * fVar205;
  auVar122._20_4_ = auVar128._20_4_ * fVar115;
  auVar122._24_4_ = auVar128._24_4_ * fVar116;
  auVar122._28_4_ = auVar137._28_4_;
  auVar128._4_4_ = auVar131._4_4_ * fVar211;
  auVar128._0_4_ = auVar131._0_4_ * fVar206;
  auVar128._8_4_ = auVar131._8_4_ * fVar212;
  auVar128._12_4_ = auVar131._12_4_ * fVar198;
  auVar128._16_4_ = auVar131._16_4_ * fVar205;
  auVar128._20_4_ = auVar131._20_4_ * fVar115;
  auVar128._24_4_ = auVar131._24_4_ * fVar116;
  auVar128._28_4_ = auVar124._28_4_;
  auVar7 = vfmadd231ps_fma(auVar132,auVar130,auVar125);
  auVar8 = vfmadd231ps_fma(auVar122,auVar130,auVar127);
  auVar9 = vfmadd231ps_fma(auVar128,auVar130,auVar129);
  auVar175 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar235,auVar126);
  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar235,auVar136);
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar225._16_4_ = 0x7fffffff;
  auVar225._20_4_ = 0x7fffffff;
  auVar225._24_4_ = 0x7fffffff;
  auVar225._28_4_ = 0x7fffffff;
  auVar120 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar235,auVar135);
  auVar126 = vandps_avx(auVar225,ZEXT1632(auVar117));
  auVar221._8_4_ = 0x219392ef;
  auVar221._0_8_ = 0x219392ef219392ef;
  auVar221._12_4_ = 0x219392ef;
  auVar221._16_4_ = 0x219392ef;
  auVar221._20_4_ = 0x219392ef;
  auVar221._24_4_ = 0x219392ef;
  auVar221._28_4_ = 0x219392ef;
  uVar110 = vcmpps_avx512vl(auVar126,auVar221,1);
  bVar22 = (bool)((byte)uVar110 & 1);
  auVar123._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar117._0_4_;
  bVar22 = (bool)((byte)(uVar110 >> 1) & 1);
  auVar123._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar117._4_4_;
  bVar22 = (bool)((byte)(uVar110 >> 2) & 1);
  auVar123._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar117._8_4_;
  bVar22 = (bool)((byte)(uVar110 >> 3) & 1);
  auVar123._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar117._12_4_;
  auVar123._16_4_ = (uint)((byte)(uVar110 >> 4) & 1) * 0x219392ef;
  auVar123._20_4_ = (uint)((byte)(uVar110 >> 5) & 1) * 0x219392ef;
  auVar123._24_4_ = (uint)((byte)(uVar110 >> 6) & 1) * 0x219392ef;
  auVar123._28_4_ = (uint)(byte)(uVar110 >> 7) * 0x219392ef;
  auVar126 = vandps_avx(auVar225,ZEXT1632(auVar118));
  uVar110 = vcmpps_avx512vl(auVar126,auVar221,1);
  bVar22 = (bool)((byte)uVar110 & 1);
  auVar134._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar118._0_4_;
  bVar22 = (bool)((byte)(uVar110 >> 1) & 1);
  auVar134._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar118._4_4_;
  bVar22 = (bool)((byte)(uVar110 >> 2) & 1);
  auVar134._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar118._8_4_;
  bVar22 = (bool)((byte)(uVar110 >> 3) & 1);
  auVar134._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar118._12_4_;
  auVar134._16_4_ = (uint)((byte)(uVar110 >> 4) & 1) * 0x219392ef;
  auVar134._20_4_ = (uint)((byte)(uVar110 >> 5) & 1) * 0x219392ef;
  auVar134._24_4_ = (uint)((byte)(uVar110 >> 6) & 1) * 0x219392ef;
  auVar134._28_4_ = (uint)(byte)(uVar110 >> 7) * 0x219392ef;
  auVar126 = vandps_avx(auVar225,ZEXT1632(auVar243));
  uVar110 = vcmpps_avx512vl(auVar126,auVar221,1);
  bVar22 = (bool)((byte)uVar110 & 1);
  auVar126._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar243._0_4_;
  bVar22 = (bool)((byte)(uVar110 >> 1) & 1);
  auVar126._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar243._4_4_;
  bVar22 = (bool)((byte)(uVar110 >> 2) & 1);
  auVar126._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar243._8_4_;
  bVar22 = (bool)((byte)(uVar110 >> 3) & 1);
  auVar126._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar243._12_4_;
  auVar126._16_4_ = (uint)((byte)(uVar110 >> 4) & 1) * 0x219392ef;
  auVar126._20_4_ = (uint)((byte)(uVar110 >> 5) & 1) * 0x219392ef;
  auVar126._24_4_ = (uint)((byte)(uVar110 >> 6) & 1) * 0x219392ef;
  auVar126._28_4_ = (uint)(byte)(uVar110 >> 7) * 0x219392ef;
  auVar125 = vrcp14ps_avx512vl(auVar123);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = &DAT_3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar222._16_4_ = 0x3f800000;
  auVar222._20_4_ = 0x3f800000;
  auVar222._24_4_ = 0x3f800000;
  auVar222._28_4_ = 0x3f800000;
  auVar117 = vfnmadd213ps_fma(auVar123,auVar125,auVar222);
  auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar125,auVar125);
  auVar125 = vrcp14ps_avx512vl(auVar134);
  auVar118 = vfnmadd213ps_fma(auVar134,auVar125,auVar222);
  auVar118 = vfmadd132ps_fma(ZEXT1632(auVar118),auVar125,auVar125);
  auVar125 = vrcp14ps_avx512vl(auVar126);
  auVar243 = vfnmadd213ps_fma(auVar126,auVar125,auVar222);
  auVar243 = vfmadd132ps_fma(ZEXT1632(auVar243),auVar125,auVar125);
  fVar206 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar39 + 0x16)) *
            *(float *)(prim + lVar39 + 0x1a);
  auVar218._4_4_ = fVar206;
  auVar218._0_4_ = fVar206;
  auVar218._8_4_ = fVar206;
  auVar218._12_4_ = fVar206;
  auVar218._16_4_ = fVar206;
  auVar218._20_4_ = fVar206;
  auVar218._24_4_ = fVar206;
  auVar218._28_4_ = fVar206;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 7 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 0xb + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar126);
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 9 + 6));
  auVar7 = vfmadd213ps_fma(auVar125,auVar218,auVar126);
  auVar126 = vcvtdq2ps_avx(auVar137);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 0xd + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar126);
  auVar8 = vfmadd213ps_fma(auVar125,auVar218,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 0x12 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  uVar110 = (ulong)(uint)((int)(uVar108 * 5) << 2);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 2 + uVar110 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar126);
  auVar9 = vfmadd213ps_fma(auVar125,auVar218,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 0x18 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar126);
  auVar10 = vfmadd213ps_fma(auVar125,auVar218,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 0x1d + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 + (ulong)(byte)PVar13 * 0x20 + 6))
  ;
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar126);
  auVar11 = vfmadd213ps_fma(auVar125,auVar218,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + ((ulong)(byte)PVar13 * 0x20 - uVar108) + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 0x23 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar126);
  auVar12 = vfmadd213ps_fma(auVar125,auVar218,auVar126);
  auVar126 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar175));
  auVar135._4_4_ = auVar117._4_4_ * auVar126._4_4_;
  auVar135._0_4_ = auVar117._0_4_ * auVar126._0_4_;
  auVar135._8_4_ = auVar117._8_4_ * auVar126._8_4_;
  auVar135._12_4_ = auVar117._12_4_ * auVar126._12_4_;
  auVar135._16_4_ = auVar126._16_4_ * 0.0;
  auVar135._20_4_ = auVar126._20_4_ * 0.0;
  auVar135._24_4_ = auVar126._24_4_ * 0.0;
  auVar135._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar175));
  auVar196._0_4_ = auVar117._0_4_ * auVar126._0_4_;
  auVar196._4_4_ = auVar117._4_4_ * auVar126._4_4_;
  auVar196._8_4_ = auVar117._8_4_ * auVar126._8_4_;
  auVar196._12_4_ = auVar117._12_4_ * auVar126._12_4_;
  auVar196._16_4_ = auVar126._16_4_ * 0.0;
  auVar196._20_4_ = auVar126._20_4_ * 0.0;
  auVar196._24_4_ = auVar126._24_4_ * 0.0;
  auVar196._28_4_ = 0;
  auVar126 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar119));
  auVar129._4_4_ = auVar118._4_4_ * auVar126._4_4_;
  auVar129._0_4_ = auVar118._0_4_ * auVar126._0_4_;
  auVar129._8_4_ = auVar118._8_4_ * auVar126._8_4_;
  auVar129._12_4_ = auVar118._12_4_ * auVar126._12_4_;
  auVar129._16_4_ = auVar126._16_4_ * 0.0;
  auVar129._20_4_ = auVar126._20_4_ * 0.0;
  auVar129._24_4_ = auVar126._24_4_ * 0.0;
  auVar129._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar119));
  auVar189._0_4_ = auVar118._0_4_ * auVar126._0_4_;
  auVar189._4_4_ = auVar118._4_4_ * auVar126._4_4_;
  auVar189._8_4_ = auVar118._8_4_ * auVar126._8_4_;
  auVar189._12_4_ = auVar118._12_4_ * auVar126._12_4_;
  auVar189._16_4_ = auVar126._16_4_ * 0.0;
  auVar189._20_4_ = auVar126._20_4_ * 0.0;
  auVar189._24_4_ = auVar126._24_4_ * 0.0;
  auVar189._28_4_ = 0;
  auVar126 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar120));
  auVar131._4_4_ = auVar243._4_4_ * auVar126._4_4_;
  auVar131._0_4_ = auVar243._0_4_ * auVar126._0_4_;
  auVar131._8_4_ = auVar243._8_4_ * auVar126._8_4_;
  auVar131._12_4_ = auVar243._12_4_ * auVar126._12_4_;
  auVar131._16_4_ = auVar126._16_4_ * 0.0;
  auVar131._20_4_ = auVar126._20_4_ * 0.0;
  auVar131._24_4_ = auVar126._24_4_ * 0.0;
  auVar131._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar120));
  auVar149._0_4_ = auVar243._0_4_ * auVar126._0_4_;
  auVar149._4_4_ = auVar243._4_4_ * auVar126._4_4_;
  auVar149._8_4_ = auVar243._8_4_ * auVar126._8_4_;
  auVar149._12_4_ = auVar243._12_4_ * auVar126._12_4_;
  auVar149._16_4_ = auVar126._16_4_ * 0.0;
  auVar149._20_4_ = auVar126._20_4_ * 0.0;
  auVar149._24_4_ = auVar126._24_4_ * 0.0;
  auVar149._28_4_ = 0;
  auVar126 = vpminsd_avx2(auVar135,auVar196);
  auVar125 = vpminsd_avx2(auVar129,auVar189);
  auVar126 = vmaxps_avx(auVar126,auVar125);
  auVar125 = vpminsd_avx2(auVar131,auVar149);
  uVar173 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar137._4_4_ = uVar173;
  auVar137._0_4_ = uVar173;
  auVar137._8_4_ = uVar173;
  auVar137._12_4_ = uVar173;
  auVar137._16_4_ = uVar173;
  auVar137._20_4_ = uVar173;
  auVar137._24_4_ = uVar173;
  auVar137._28_4_ = uVar173;
  auVar125 = vmaxps_avx512vl(auVar125,auVar137);
  auVar126 = vmaxps_avx(auVar126,auVar125);
  auVar125._8_4_ = 0x3f7ffffa;
  auVar125._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar125._12_4_ = 0x3f7ffffa;
  auVar125._16_4_ = 0x3f7ffffa;
  auVar125._20_4_ = 0x3f7ffffa;
  auVar125._24_4_ = 0x3f7ffffa;
  auVar125._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar126,auVar125);
  auVar126 = vpmaxsd_avx2(auVar135,auVar196);
  auVar125 = vpmaxsd_avx2(auVar129,auVar189);
  auVar126 = vminps_avx(auVar126,auVar125);
  auVar125 = vpmaxsd_avx2(auVar131,auVar149);
  uVar173 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar136._4_4_ = uVar173;
  auVar136._0_4_ = uVar173;
  auVar136._8_4_ = uVar173;
  auVar136._12_4_ = uVar173;
  auVar136._16_4_ = uVar173;
  auVar136._20_4_ = uVar173;
  auVar136._24_4_ = uVar173;
  auVar136._28_4_ = uVar173;
  auVar125 = vminps_avx512vl(auVar125,auVar136);
  auVar126 = vminps_avx(auVar126,auVar125);
  auVar127._8_4_ = 0x3f800003;
  auVar127._0_8_ = 0x3f8000033f800003;
  auVar127._12_4_ = 0x3f800003;
  auVar127._16_4_ = 0x3f800003;
  auVar127._20_4_ = 0x3f800003;
  auVar127._24_4_ = 0x3f800003;
  auVar127._28_4_ = 0x3f800003;
  auVar126 = vmulps_avx512vl(auVar126,auVar127);
  auVar125 = vpbroadcastd_avx512vl();
  uVar36 = vpcmpgtd_avx512vl(auVar125,_DAT_0205a920);
  uVar174 = vcmpps_avx512vl(local_320,auVar126,2);
  if ((byte)((byte)uVar174 & (byte)uVar36) != 0) {
    uVar110 = (ulong)(byte)((byte)uVar174 & (byte)uVar36);
    local_808 = pre->ray_space + k;
    local_918 = (undefined1 (*) [32])local_100;
    auVar187 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar187);
    do {
      lVar39 = 0;
      for (uVar108 = uVar110; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x8000000000000000) {
        lVar39 = lVar39 + 1;
      }
      uVar112 = *(uint *)(prim + 2);
      uVar14 = *(uint *)(prim + lVar39 * 4 + 6);
      pGVar17 = (context->scene->geometries).items[uVar112].ptr;
      uVar108 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                                (ulong)uVar14 *
                                pGVar17[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar206 = (pGVar17->time_range).lower;
      fVar206 = pGVar17->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar206) /
                ((pGVar17->time_range).upper - fVar206));
      auVar117 = vroundss_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),9);
      auVar117 = vminss_avx(auVar117,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
      auVar117 = vmaxss_avx(ZEXT816(0) << 0x20,auVar117);
      fVar206 = fVar206 - auVar117._0_4_;
      fVar172 = 1.0 - fVar206;
      _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar113 = (long)(int)auVar117._0_4_ * 0x38;
      lVar111 = *(long *)(_Var18 + 0x10 + lVar113);
      lVar19 = *(long *)(_Var18 + 0x38 + lVar113);
      lVar20 = *(long *)(_Var18 + 0x48 + lVar113);
      auVar175._4_4_ = fVar206;
      auVar175._0_4_ = fVar206;
      auVar175._8_4_ = fVar206;
      auVar175._12_4_ = fVar206;
      pfVar3 = (float *)(lVar19 + lVar20 * uVar108);
      auVar224._0_4_ = fVar206 * *pfVar3;
      auVar224._4_4_ = fVar206 * pfVar3[1];
      auVar224._8_4_ = fVar206 * pfVar3[2];
      auVar224._12_4_ = fVar206 * pfVar3[3];
      lVar39 = uVar108 + 1;
      auVar117 = vmulps_avx512vl(auVar175,*(undefined1 (*) [16])(lVar19 + lVar20 * lVar39));
      p_Var21 = pGVar17[4].occlusionFilterN;
      auVar119._4_4_ = fVar172;
      auVar119._0_4_ = fVar172;
      auVar119._8_4_ = fVar172;
      auVar119._12_4_ = fVar172;
      auVar7 = vfmadd231ps_fma(auVar224,auVar119,
                               *(undefined1 (*) [16])
                                (*(long *)(_Var18 + lVar113) + lVar111 * uVar108));
      _local_8d0 = vfmadd231ps_avx512vl
                             (auVar117,auVar119,
                              *(undefined1 (*) [16])(*(long *)(_Var18 + lVar113) + lVar111 * lVar39)
                             );
      pfVar3 = (float *)(*(long *)(p_Var21 + lVar113 + 0x38) +
                        uVar108 * *(long *)(p_Var21 + lVar113 + 0x48));
      auVar227._0_4_ = fVar206 * *pfVar3;
      auVar227._4_4_ = fVar206 * pfVar3[1];
      auVar227._8_4_ = fVar206 * pfVar3[2];
      auVar227._12_4_ = fVar206 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var21 + lVar113 + 0x38) +
                        *(long *)(p_Var21 + lVar113 + 0x48) * lVar39);
      auVar230._0_4_ = fVar206 * *pfVar3;
      auVar230._4_4_ = fVar206 * pfVar3[1];
      auVar230._8_4_ = fVar206 * pfVar3[2];
      auVar230._12_4_ = fVar206 * pfVar3[3];
      auVar118 = vfmadd231ps_fma(auVar227,auVar119,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var21 + lVar113) +
                                  *(long *)(p_Var21 + lVar113 + 0x10) * uVar108));
      auVar243 = vfmadd231ps_fma(auVar230,auVar119,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var21 + lVar113) +
                                  *(long *)(p_Var21 + lVar113 + 0x10) * lVar39));
      iVar15 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar117 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar39 = (long)iVar15 * 0x44;
      auVar120._8_4_ = 0xbeaaaaab;
      auVar120._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar120._12_4_ = 0xbeaaaaab;
      local_8e0 = vfnmadd213ps_fma(auVar118,auVar120,auVar7);
      local_8f0 = vfmadd213ps_avx512vl(auVar243,auVar120,_local_8d0);
      auVar243 = vsubps_avx(auVar7,auVar117);
      uVar173 = auVar243._0_4_;
      auVar121._4_4_ = uVar173;
      auVar121._0_4_ = uVar173;
      auVar121._8_4_ = uVar173;
      auVar121._12_4_ = uVar173;
      auVar118 = vshufps_avx(auVar243,auVar243,0x55);
      aVar5 = (local_808->vx).field_0;
      aVar6 = (local_808->vy).field_0;
      fVar206 = (local_808->vz).field_0.m128[0];
      fVar172 = *(float *)((long)&(local_808->vz).field_0 + 4);
      fVar211 = *(float *)((long)&(local_808->vz).field_0 + 8);
      fVar212 = *(float *)((long)&(local_808->vz).field_0 + 0xc);
      auVar243 = vshufps_avx(auVar243,auVar243,0xaa);
      auVar229._0_4_ = fVar206 * auVar243._0_4_;
      auVar229._4_4_ = fVar172 * auVar243._4_4_;
      auVar229._8_4_ = fVar211 * auVar243._8_4_;
      auVar229._12_4_ = fVar212 * auVar243._12_4_;
      auVar118 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar6,auVar118);
      auVar8 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar5,auVar121);
      auVar243 = vsubps_avx(local_8e0,auVar117);
      uVar173 = auVar243._0_4_;
      auVar190._4_4_ = uVar173;
      auVar190._0_4_ = uVar173;
      auVar190._8_4_ = uVar173;
      auVar190._12_4_ = uVar173;
      auVar118 = vshufps_avx(auVar243,auVar243,0x55);
      auVar243 = vshufps_avx(auVar243,auVar243,0xaa);
      auVar231._0_4_ = fVar206 * auVar243._0_4_;
      auVar231._4_4_ = fVar172 * auVar243._4_4_;
      auVar231._8_4_ = fVar211 * auVar243._8_4_;
      auVar231._12_4_ = fVar212 * auVar243._12_4_;
      auVar118 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar6,auVar118);
      auVar9 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar5,auVar190);
      auVar243 = vsubps_avx(local_8f0,auVar117);
      uVar173 = auVar243._0_4_;
      auVar191._4_4_ = uVar173;
      auVar191._0_4_ = uVar173;
      auVar191._8_4_ = uVar173;
      auVar191._12_4_ = uVar173;
      auVar118 = vshufps_avx(auVar243,auVar243,0x55);
      auVar243 = vshufps_avx(auVar243,auVar243,0xaa);
      auVar232._0_4_ = fVar206 * auVar243._0_4_;
      auVar232._4_4_ = fVar172 * auVar243._4_4_;
      auVar232._8_4_ = fVar211 * auVar243._8_4_;
      auVar232._12_4_ = fVar212 * auVar243._12_4_;
      auVar118 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar6,auVar118);
      auVar243 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar5,auVar191);
      auVar118 = vsubps_avx512vl(_local_8d0,auVar117);
      uVar173 = auVar118._0_4_;
      auVar188._4_4_ = uVar173;
      auVar188._0_4_ = uVar173;
      auVar188._8_4_ = uVar173;
      auVar188._12_4_ = uVar173;
      auVar117 = vshufps_avx(auVar118,auVar118,0x55);
      auVar118 = vshufps_avx(auVar118,auVar118,0xaa);
      auVar237._0_4_ = fVar206 * auVar118._0_4_;
      auVar237._4_4_ = fVar172 * auVar118._4_4_;
      auVar237._8_4_ = fVar211 * auVar118._8_4_;
      auVar237._12_4_ = fVar212 * auVar118._12_4_;
      auVar117 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar6,auVar117);
      auVar10 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar5,auVar188);
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar39);
      uVar173 = auVar8._0_4_;
      local_760._4_4_ = uVar173;
      local_760._0_4_ = uVar173;
      local_760._8_4_ = uVar173;
      local_760._12_4_ = uVar173;
      local_760._16_4_ = uVar173;
      local_760._20_4_ = uVar173;
      local_760._24_4_ = uVar173;
      local_760._28_4_ = uVar173;
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x484);
      auVar180._8_4_ = 1;
      auVar180._0_8_ = 0x100000001;
      auVar180._12_4_ = 1;
      auVar180._16_4_ = 1;
      auVar180._20_4_ = 1;
      auVar180._24_4_ = 1;
      auVar180._28_4_ = 1;
      local_6e0 = vpermps_avx2(auVar180,ZEXT1632(auVar8));
      local_780 = vbroadcastss_avx512vl(auVar9);
      local_700 = vpermps_avx512vl(auVar180,ZEXT1632(auVar9));
      auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x908);
      local_7a0 = vbroadcastss_avx512vl(auVar243);
      local_7c0 = vpermps_avx512vl(auVar180,ZEXT1632(auVar243));
      auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0xd8c);
      uVar173 = auVar10._0_4_;
      local_720._4_4_ = uVar173;
      local_720._0_4_ = uVar173;
      local_720._8_4_ = uVar173;
      local_720._12_4_ = uVar173;
      local_720._16_4_ = uVar173;
      local_720._20_4_ = uVar173;
      local_720._24_4_ = uVar173;
      local_720._28_4_ = uVar173;
      local_740 = vpermps_avx2(auVar180,ZEXT1632(auVar10));
      auVar127 = vmulps_avx512vl(local_720,auVar136);
      auVar128 = vmulps_avx512vl(local_740,auVar136);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar137,local_7a0);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar137,local_7c0);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar125,local_780);
      auVar129 = vfmadd231ps_avx512vl(auVar128,auVar125,local_700);
      auVar130 = vfmadd231ps_avx512vl(auVar127,auVar126,local_760);
      auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar39);
      auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x484);
      auVar135 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x908);
      auVar124 = vfmadd231ps_avx512vl(auVar129,auVar126,local_6e0);
      auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0xd8c);
      auVar187 = ZEXT3264(local_720);
      auVar131 = vmulps_avx512vl(local_720,auVar129);
      auVar249 = ZEXT3264(local_740);
      auVar132 = vmulps_avx512vl(local_740,auVar129);
      auVar131 = vfmadd231ps_avx512vl(auVar131,auVar135,local_7a0);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar135,local_7c0);
      auVar131 = vfmadd231ps_avx512vl(auVar131,auVar128,local_780);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar128,local_700);
      auVar11 = vfmadd231ps_fma(auVar131,auVar127,local_760);
      auVar12 = vfmadd231ps_fma(auVar132,auVar127,local_6e0);
      auVar132 = vsubps_avx512vl(ZEXT1632(auVar11),auVar130);
      auVar133 = vsubps_avx512vl(ZEXT1632(auVar12),auVar124);
      auVar131 = vmulps_avx512vl(auVar124,auVar132);
      auVar122 = vmulps_avx512vl(auVar130,auVar133);
      auVar131 = vsubps_avx512vl(auVar131,auVar122);
      auVar117 = vshufps_avx(auVar7,auVar7,0xff);
      uVar174 = auVar117._0_8_;
      local_340._8_8_ = uVar174;
      local_340._0_8_ = uVar174;
      local_340._16_8_ = uVar174;
      local_340._24_8_ = uVar174;
      auVar117 = vshufps_avx(local_8e0,local_8e0,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar117);
      auVar117 = vshufps_avx(local_8f0,local_8f0,0xff);
      local_380 = vbroadcastsd_avx512vl(auVar117);
      auVar117 = vshufps_avx512vl(_local_8d0,_local_8d0,0xff);
      uVar174 = auVar117._0_8_;
      register0x00001248 = uVar174;
      local_3a0 = uVar174;
      register0x00001250 = uVar174;
      register0x00001258 = uVar174;
      auVar122 = vmulps_avx512vl(_local_3a0,auVar136);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar137,local_380);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar125,local_360);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar126,local_340);
      auVar123 = vmulps_avx512vl(_local_3a0,auVar129);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar135,local_380);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar128,local_360);
      auVar175 = vfmadd231ps_fma(auVar123,auVar127,local_340);
      auVar123 = vmulps_avx512vl(auVar133,auVar133);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar132,auVar132);
      auVar134 = vmaxps_avx512vl(auVar122,ZEXT1632(auVar175));
      auVar134 = vmulps_avx512vl(auVar134,auVar134);
      auVar123 = vmulps_avx512vl(auVar134,auVar123);
      auVar131 = vmulps_avx512vl(auVar131,auVar131);
      uVar174 = vcmpps_avx512vl(auVar131,auVar123,2);
      auVar117 = vblendps_avx(auVar8,auVar7,8);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar118 = vandps_avx512vl(auVar117,auVar119);
      auVar117 = vblendps_avx(auVar9,local_8e0,8);
      auVar117 = vandps_avx512vl(auVar117,auVar119);
      auVar118 = vmaxps_avx(auVar118,auVar117);
      auVar117 = vblendps_avx(auVar243,local_8f0,8);
      auVar120 = vandps_avx512vl(auVar117,auVar119);
      auVar117 = vblendps_avx(auVar10,_local_8d0,8);
      auVar117 = vandps_avx512vl(auVar117,auVar119);
      auVar117 = vmaxps_avx(auVar120,auVar117);
      auVar117 = vmaxps_avx(auVar118,auVar117);
      auVar118 = vmovshdup_avx(auVar117);
      auVar118 = vmaxss_avx(auVar118,auVar117);
      auVar117 = vshufpd_avx(auVar117,auVar117,1);
      auVar117 = vmaxss_avx(auVar117,auVar118);
      auVar118 = vcvtsi2ss_avx512f(_local_8d0,iVar15);
      auVar226._0_4_ = auVar118._0_4_;
      auVar226._4_4_ = auVar226._0_4_;
      auVar226._8_4_ = auVar226._0_4_;
      auVar226._12_4_ = auVar226._0_4_;
      auVar226._16_4_ = auVar226._0_4_;
      auVar226._20_4_ = auVar226._0_4_;
      auVar226._24_4_ = auVar226._0_4_;
      auVar226._28_4_ = auVar226._0_4_;
      uVar36 = vcmpps_avx512vl(auVar226,_DAT_02020f40,0xe);
      bVar114 = (byte)uVar174 & (byte)uVar36;
      local_910 = vmulss_avx512f(auVar117,ZEXT416(0x35000000));
      auVar203._8_4_ = 2;
      auVar203._0_8_ = 0x200000002;
      auVar203._12_4_ = 2;
      auVar203._16_4_ = 2;
      auVar203._20_4_ = 2;
      auVar203._24_4_ = 2;
      auVar203._28_4_ = 2;
      local_3c0 = vpermps_avx512vl(auVar203,ZEXT1632(auVar8));
      local_3e0 = vpermps_avx512vl(auVar203,ZEXT1632(auVar9));
      local_400 = vpermps_avx512vl(auVar203,ZEXT1632(auVar243));
      auVar131 = vpermps_avx2(auVar203,ZEXT1632(auVar10));
      uVar173 = *(undefined4 *)(ray + k * 4 + 0xc0);
      auVar117 = local_3e0._0_16_;
      uVar234 = local_910._0_4_;
      local_960 = auVar7._0_8_;
      uStack_958 = auVar7._8_8_;
      if (bVar114 == 0) {
        auVar117 = vxorps_avx512vl(auVar117,auVar117);
        auVar244 = ZEXT1664(auVar117);
        auVar242 = ZEXT3264(local_760);
        auVar241 = ZEXT3264(local_6e0);
        auVar245 = ZEXT3264(local_780);
        auVar246 = ZEXT3264(local_700);
        auVar247 = ZEXT3264(local_7a0);
        auVar248 = ZEXT3264(local_7c0);
      }
      else {
        uStack_7fc = 0;
        uStack_7f8 = 0;
        uStack_7f4 = 0;
        auVar129 = vmulps_avx512vl(auVar131,auVar129);
        auVar135 = vfmadd213ps_avx512vl(auVar135,local_400,auVar129);
        auVar128 = vfmadd213ps_avx512vl(auVar128,local_3e0,auVar135);
        auVar128 = vfmadd213ps_avx512vl(auVar127,local_3c0,auVar128);
        auVar136 = vmulps_avx512vl(auVar131,auVar136);
        auVar137 = vfmadd213ps_avx512vl(auVar137,local_400,auVar136);
        auVar135 = vfmadd213ps_avx512vl(auVar125,local_3e0,auVar137);
        auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x1210);
        auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x1694);
        auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x1b18);
        auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x1f9c);
        auVar135 = vfmadd213ps_avx512vl(auVar126,local_3c0,auVar135);
        auVar126 = vmulps_avx512vl(local_720,auVar127);
        auVar129 = vmulps_avx512vl(local_740,auVar127);
        auVar233._0_4_ = auVar131._0_4_ * auVar127._0_4_;
        auVar233._4_4_ = auVar131._4_4_ * auVar127._4_4_;
        auVar233._8_4_ = auVar131._8_4_ * auVar127._8_4_;
        auVar233._12_4_ = auVar131._12_4_ * auVar127._12_4_;
        auVar233._16_4_ = auVar131._16_4_ * auVar127._16_4_;
        auVar233._20_4_ = auVar131._20_4_ * auVar127._20_4_;
        auVar233._24_4_ = auVar131._24_4_ * auVar127._24_4_;
        auVar233._28_4_ = 0;
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar136,local_7a0);
        auVar127 = vfmadd231ps_avx512vl(auVar129,auVar136,local_7c0);
        auVar136 = vfmadd231ps_avx512vl(auVar233,local_400,auVar136);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar137,local_780);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar137,local_700);
        auVar129 = vfmadd231ps_avx512vl(auVar136,local_3e0,auVar137);
        auVar123 = vfmadd231ps_avx512vl(auVar126,auVar125,local_760);
        auVar241 = ZEXT3264(local_6e0);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar125,local_6e0);
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x1210);
        auVar137 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x1b18);
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x1f9c);
        auVar129 = vfmadd231ps_avx512vl(auVar129,local_3c0,auVar125);
        auVar125 = vmulps_avx512vl(local_720,auVar136);
        auVar134 = vmulps_avx512vl(local_740,auVar136);
        auVar51._4_4_ = auVar131._4_4_ * auVar136._4_4_;
        auVar51._0_4_ = auVar131._0_4_ * auVar136._0_4_;
        auVar51._8_4_ = auVar131._8_4_ * auVar136._8_4_;
        auVar51._12_4_ = auVar131._12_4_ * auVar136._12_4_;
        auVar51._16_4_ = auVar131._16_4_ * auVar136._16_4_;
        auVar51._20_4_ = auVar131._20_4_ * auVar136._20_4_;
        auVar51._24_4_ = auVar131._24_4_ * auVar136._24_4_;
        auVar51._28_4_ = auVar136._28_4_;
        auVar136 = vfmadd231ps_avx512vl(auVar125,auVar137,local_7a0);
        auVar134 = vfmadd231ps_avx512vl(auVar134,auVar137,local_7c0);
        auVar137 = vfmadd231ps_avx512vl(auVar51,local_400,auVar137);
        auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x1694);
        auVar136 = vfmadd231ps_avx512vl(auVar136,auVar125,local_780);
        auVar134 = vfmadd231ps_avx512vl(auVar134,auVar125,local_700);
        auVar125 = vfmadd231ps_avx512vl(auVar137,local_3e0,auVar125);
        auVar137 = vfmadd231ps_avx512vl(auVar136,auVar126,local_760);
        auVar136 = vfmadd231ps_avx512vl(auVar134,auVar126,local_6e0);
        auVar134 = vfmadd231ps_avx512vl(auVar125,local_3c0,auVar126);
        auVar239._8_4_ = 0x7fffffff;
        auVar239._0_8_ = 0x7fffffff7fffffff;
        auVar239._12_4_ = 0x7fffffff;
        auVar239._16_4_ = 0x7fffffff;
        auVar239._20_4_ = 0x7fffffff;
        auVar239._24_4_ = 0x7fffffff;
        auVar239._28_4_ = 0x7fffffff;
        auVar126 = vandps_avx(auVar123,auVar239);
        auVar125 = vandps_avx(auVar127,auVar239);
        auVar125 = vmaxps_avx(auVar126,auVar125);
        auVar126 = vandps_avx(auVar129,auVar239);
        auVar126 = vmaxps_avx(auVar125,auVar126);
        auVar129 = vbroadcastss_avx512vl(local_910);
        uVar108 = vcmpps_avx512vl(auVar126,auVar129,1);
        bVar22 = (bool)((byte)uVar108 & 1);
        auVar138._0_4_ = (float)((uint)bVar22 * auVar132._0_4_ | (uint)!bVar22 * auVar123._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar22 * auVar132._4_4_ | (uint)!bVar22 * auVar123._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar22 * auVar132._8_4_ | (uint)!bVar22 * auVar123._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar22 * auVar132._12_4_ | (uint)!bVar22 * auVar123._12_4_);
        bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
        auVar138._16_4_ = (float)((uint)bVar22 * auVar132._16_4_ | (uint)!bVar22 * auVar123._16_4_);
        bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
        auVar138._20_4_ = (float)((uint)bVar22 * auVar132._20_4_ | (uint)!bVar22 * auVar123._20_4_);
        bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
        auVar138._24_4_ = (float)((uint)bVar22 * auVar132._24_4_ | (uint)!bVar22 * auVar123._24_4_);
        bVar22 = SUB81(uVar108 >> 7,0);
        auVar138._28_4_ = (uint)bVar22 * auVar132._28_4_ | (uint)!bVar22 * auVar123._28_4_;
        bVar22 = (bool)((byte)uVar108 & 1);
        auVar139._0_4_ = (float)((uint)bVar22 * auVar133._0_4_ | (uint)!bVar22 * auVar127._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar139._4_4_ = (float)((uint)bVar22 * auVar133._4_4_ | (uint)!bVar22 * auVar127._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar139._8_4_ = (float)((uint)bVar22 * auVar133._8_4_ | (uint)!bVar22 * auVar127._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar139._12_4_ = (float)((uint)bVar22 * auVar133._12_4_ | (uint)!bVar22 * auVar127._12_4_);
        bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
        auVar139._16_4_ = (float)((uint)bVar22 * auVar133._16_4_ | (uint)!bVar22 * auVar127._16_4_);
        bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
        auVar139._20_4_ = (float)((uint)bVar22 * auVar133._20_4_ | (uint)!bVar22 * auVar127._20_4_);
        bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
        auVar139._24_4_ = (float)((uint)bVar22 * auVar133._24_4_ | (uint)!bVar22 * auVar127._24_4_);
        bVar22 = SUB81(uVar108 >> 7,0);
        auVar139._28_4_ = (uint)bVar22 * auVar133._28_4_ | (uint)!bVar22 * auVar127._28_4_;
        auVar126 = vandps_avx(auVar239,auVar137);
        auVar125 = vandps_avx(auVar136,auVar239);
        auVar125 = vmaxps_avx(auVar126,auVar125);
        auVar126 = vandps_avx(auVar134,auVar239);
        auVar126 = vmaxps_avx(auVar125,auVar126);
        uVar108 = vcmpps_avx512vl(auVar126,auVar129,1);
        bVar22 = (bool)((byte)uVar108 & 1);
        auVar140._0_4_ = (float)((uint)bVar22 * auVar132._0_4_ | (uint)!bVar22 * auVar137._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar140._4_4_ = (float)((uint)bVar22 * auVar132._4_4_ | (uint)!bVar22 * auVar137._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar140._8_4_ = (float)((uint)bVar22 * auVar132._8_4_ | (uint)!bVar22 * auVar137._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar140._12_4_ = (float)((uint)bVar22 * auVar132._12_4_ | (uint)!bVar22 * auVar137._12_4_);
        bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
        auVar140._16_4_ = (float)((uint)bVar22 * auVar132._16_4_ | (uint)!bVar22 * auVar137._16_4_);
        bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
        auVar140._20_4_ = (float)((uint)bVar22 * auVar132._20_4_ | (uint)!bVar22 * auVar137._20_4_);
        bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
        auVar140._24_4_ = (float)((uint)bVar22 * auVar132._24_4_ | (uint)!bVar22 * auVar137._24_4_);
        bVar22 = SUB81(uVar108 >> 7,0);
        auVar140._28_4_ = (uint)bVar22 * auVar132._28_4_ | (uint)!bVar22 * auVar137._28_4_;
        bVar22 = (bool)((byte)uVar108 & 1);
        auVar141._0_4_ = (float)((uint)bVar22 * auVar133._0_4_ | (uint)!bVar22 * auVar136._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar141._4_4_ = (float)((uint)bVar22 * auVar133._4_4_ | (uint)!bVar22 * auVar136._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar141._8_4_ = (float)((uint)bVar22 * auVar133._8_4_ | (uint)!bVar22 * auVar136._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar141._12_4_ = (float)((uint)bVar22 * auVar133._12_4_ | (uint)!bVar22 * auVar136._12_4_);
        bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
        auVar141._16_4_ = (float)((uint)bVar22 * auVar133._16_4_ | (uint)!bVar22 * auVar136._16_4_);
        bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
        auVar141._20_4_ = (float)((uint)bVar22 * auVar133._20_4_ | (uint)!bVar22 * auVar136._20_4_);
        bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
        auVar141._24_4_ = (float)((uint)bVar22 * auVar133._24_4_ | (uint)!bVar22 * auVar136._24_4_);
        bVar22 = SUB81(uVar108 >> 7,0);
        auVar141._28_4_ = (uint)bVar22 * auVar133._28_4_ | (uint)!bVar22 * auVar136._28_4_;
        auVar121 = vxorps_avx512vl(auVar117,auVar117);
        auVar244 = ZEXT1664(auVar121);
        auVar126 = vfmadd213ps_avx512vl(auVar138,auVar138,ZEXT1632(auVar121));
        auVar117 = vfmadd231ps_fma(auVar126,auVar139,auVar139);
        auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar117));
        fVar206 = auVar126._0_4_;
        fVar172 = auVar126._4_4_;
        fVar211 = auVar126._8_4_;
        fVar212 = auVar126._12_4_;
        fVar198 = auVar126._16_4_;
        fVar205 = auVar126._20_4_;
        fVar115 = auVar126._24_4_;
        auVar52._4_4_ = fVar172 * fVar172 * fVar172 * auVar117._4_4_ * -0.5;
        auVar52._0_4_ = fVar206 * fVar206 * fVar206 * auVar117._0_4_ * -0.5;
        auVar52._8_4_ = fVar211 * fVar211 * fVar211 * auVar117._8_4_ * -0.5;
        auVar52._12_4_ = fVar212 * fVar212 * fVar212 * auVar117._12_4_ * -0.5;
        auVar52._16_4_ = fVar198 * fVar198 * fVar198 * -0.0;
        auVar52._20_4_ = fVar205 * fVar205 * fVar205 * -0.0;
        auVar52._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar52._28_4_ = auVar134._28_4_;
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar126 = vfmadd231ps_avx512vl(auVar52,auVar125,auVar126);
        auVar53._4_4_ = auVar139._4_4_ * auVar126._4_4_;
        auVar53._0_4_ = auVar139._0_4_ * auVar126._0_4_;
        auVar53._8_4_ = auVar139._8_4_ * auVar126._8_4_;
        auVar53._12_4_ = auVar139._12_4_ * auVar126._12_4_;
        auVar53._16_4_ = auVar139._16_4_ * auVar126._16_4_;
        auVar53._20_4_ = auVar139._20_4_ * auVar126._20_4_;
        auVar53._24_4_ = auVar139._24_4_ * auVar126._24_4_;
        auVar53._28_4_ = 0;
        auVar54._4_4_ = auVar126._4_4_ * -auVar138._4_4_;
        auVar54._0_4_ = auVar126._0_4_ * -auVar138._0_4_;
        auVar54._8_4_ = auVar126._8_4_ * -auVar138._8_4_;
        auVar54._12_4_ = auVar126._12_4_ * -auVar138._12_4_;
        auVar54._16_4_ = auVar126._16_4_ * -auVar138._16_4_;
        auVar54._20_4_ = auVar126._20_4_ * -auVar138._20_4_;
        auVar54._24_4_ = auVar126._24_4_ * -auVar138._24_4_;
        auVar54._28_4_ = auVar139._28_4_;
        auVar126 = vmulps_avx512vl(auVar126,ZEXT1632(auVar121));
        auVar132 = ZEXT1632(auVar121);
        auVar137 = vfmadd213ps_avx512vl(auVar140,auVar140,auVar132);
        auVar117 = vfmadd231ps_fma(auVar137,auVar141,auVar141);
        auVar137 = vrsqrt14ps_avx512vl(ZEXT1632(auVar117));
        fVar206 = auVar137._0_4_;
        fVar172 = auVar137._4_4_;
        fVar211 = auVar137._8_4_;
        fVar212 = auVar137._12_4_;
        fVar198 = auVar137._16_4_;
        fVar205 = auVar137._20_4_;
        fVar115 = auVar137._24_4_;
        auVar55._4_4_ = fVar172 * fVar172 * fVar172 * auVar117._4_4_ * -0.5;
        auVar55._0_4_ = fVar206 * fVar206 * fVar206 * auVar117._0_4_ * -0.5;
        auVar55._8_4_ = fVar211 * fVar211 * fVar211 * auVar117._8_4_ * -0.5;
        auVar55._12_4_ = fVar212 * fVar212 * fVar212 * auVar117._12_4_ * -0.5;
        auVar55._16_4_ = fVar198 * fVar198 * fVar198 * -0.0;
        auVar55._20_4_ = fVar205 * fVar205 * fVar205 * -0.0;
        auVar55._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar55._28_4_ = 0;
        auVar125 = vfmadd231ps_avx512vl(auVar55,auVar125,auVar137);
        auVar56._4_4_ = auVar141._4_4_ * auVar125._4_4_;
        auVar56._0_4_ = auVar141._0_4_ * auVar125._0_4_;
        auVar56._8_4_ = auVar141._8_4_ * auVar125._8_4_;
        auVar56._12_4_ = auVar141._12_4_ * auVar125._12_4_;
        auVar56._16_4_ = auVar141._16_4_ * auVar125._16_4_;
        auVar56._20_4_ = auVar141._20_4_ * auVar125._20_4_;
        auVar56._24_4_ = auVar141._24_4_ * auVar125._24_4_;
        auVar56._28_4_ = auVar137._28_4_;
        auVar57._4_4_ = -auVar140._4_4_ * auVar125._4_4_;
        auVar57._0_4_ = -auVar140._0_4_ * auVar125._0_4_;
        auVar57._8_4_ = -auVar140._8_4_ * auVar125._8_4_;
        auVar57._12_4_ = -auVar140._12_4_ * auVar125._12_4_;
        auVar57._16_4_ = -auVar140._16_4_ * auVar125._16_4_;
        auVar57._20_4_ = -auVar140._20_4_ * auVar125._20_4_;
        auVar57._24_4_ = -auVar140._24_4_ * auVar125._24_4_;
        auVar57._28_4_ = auVar140._28_4_ ^ 0x80000000;
        auVar125 = vmulps_avx512vl(auVar125,auVar132);
        auVar117 = vfmadd213ps_fma(auVar53,auVar122,auVar130);
        auVar118 = vfmadd213ps_fma(auVar54,auVar122,auVar124);
        auVar137 = vfmadd213ps_avx512vl(auVar126,auVar122,auVar135);
        auVar136 = vfmadd213ps_avx512vl(auVar56,ZEXT1632(auVar175),ZEXT1632(auVar11));
        auVar119 = vfnmadd213ps_fma(auVar53,auVar122,auVar130);
        auVar129 = ZEXT1632(auVar175);
        auVar243 = vfmadd213ps_fma(auVar57,auVar129,ZEXT1632(auVar12));
        auVar120 = vfnmadd213ps_fma(auVar54,auVar122,auVar124);
        auVar8 = vfmadd213ps_fma(auVar125,auVar129,auVar128);
        auVar127 = vfnmadd231ps_avx512vl(auVar135,auVar122,auVar126);
        auVar11 = vfnmadd213ps_fma(auVar56,auVar129,ZEXT1632(auVar11));
        auVar12 = vfnmadd213ps_fma(auVar57,auVar129,ZEXT1632(auVar12));
        auVar188 = vfnmadd231ps_fma(auVar128,ZEXT1632(auVar175),auVar125);
        auVar125 = vsubps_avx512vl(auVar136,ZEXT1632(auVar119));
        auVar126 = vsubps_avx(ZEXT1632(auVar243),ZEXT1632(auVar120));
        auVar128 = vsubps_avx512vl(ZEXT1632(auVar8),auVar127);
        auVar135 = vmulps_avx512vl(auVar126,auVar127);
        auVar9 = vfmsub231ps_fma(auVar135,ZEXT1632(auVar120),auVar128);
        auVar58._4_4_ = auVar119._4_4_ * auVar128._4_4_;
        auVar58._0_4_ = auVar119._0_4_ * auVar128._0_4_;
        auVar58._8_4_ = auVar119._8_4_ * auVar128._8_4_;
        auVar58._12_4_ = auVar119._12_4_ * auVar128._12_4_;
        auVar58._16_4_ = auVar128._16_4_ * 0.0;
        auVar58._20_4_ = auVar128._20_4_ * 0.0;
        auVar58._24_4_ = auVar128._24_4_ * 0.0;
        auVar58._28_4_ = auVar128._28_4_;
        auVar128 = vfmsub231ps_avx512vl(auVar58,auVar127,auVar125);
        auVar59._4_4_ = auVar120._4_4_ * auVar125._4_4_;
        auVar59._0_4_ = auVar120._0_4_ * auVar125._0_4_;
        auVar59._8_4_ = auVar120._8_4_ * auVar125._8_4_;
        auVar59._12_4_ = auVar120._12_4_ * auVar125._12_4_;
        auVar59._16_4_ = auVar125._16_4_ * 0.0;
        auVar59._20_4_ = auVar125._20_4_ * 0.0;
        auVar59._24_4_ = auVar125._24_4_ * 0.0;
        auVar59._28_4_ = auVar125._28_4_;
        auVar10 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar119),auVar126);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar132,auVar128);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar132,ZEXT1632(auVar9));
        auVar133 = ZEXT1632(auVar121);
        uVar108 = vcmpps_avx512vl(auVar126,auVar133,2);
        bVar107 = (byte)uVar108;
        fVar115 = (float)((uint)(bVar107 & 1) * auVar117._0_4_ |
                         (uint)!(bool)(bVar107 & 1) * auVar11._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        fVar164 = (float)((uint)bVar22 * auVar117._4_4_ | (uint)!bVar22 * auVar11._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        fVar165 = (float)((uint)bVar22 * auVar117._8_4_ | (uint)!bVar22 * auVar11._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        fVar168 = (float)((uint)bVar22 * auVar117._12_4_ | (uint)!bVar22 * auVar11._12_4_);
        auVar135 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar165,CONCAT44(fVar164,fVar115))));
        fVar116 = (float)((uint)(bVar107 & 1) * auVar118._0_4_ |
                         (uint)!(bool)(bVar107 & 1) * auVar12._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        fVar197 = (float)((uint)bVar22 * auVar118._4_4_ | (uint)!bVar22 * auVar12._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        fVar166 = (float)((uint)bVar22 * auVar118._8_4_ | (uint)!bVar22 * auVar12._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        fVar169 = (float)((uint)bVar22 * auVar118._12_4_ | (uint)!bVar22 * auVar12._12_4_);
        auVar129 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar166,CONCAT44(fVar197,fVar116))));
        auVar142._0_4_ =
             (float)((uint)(bVar107 & 1) * auVar137._0_4_ |
                    (uint)!(bool)(bVar107 & 1) * auVar188._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar142._4_4_ = (float)((uint)bVar22 * auVar137._4_4_ | (uint)!bVar22 * auVar188._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar142._8_4_ = (float)((uint)bVar22 * auVar137._8_4_ | (uint)!bVar22 * auVar188._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar142._12_4_ = (float)((uint)bVar22 * auVar137._12_4_ | (uint)!bVar22 * auVar188._12_4_);
        fVar172 = (float)((uint)((byte)(uVar108 >> 4) & 1) * auVar137._16_4_);
        auVar142._16_4_ = fVar172;
        fVar206 = (float)((uint)((byte)(uVar108 >> 5) & 1) * auVar137._20_4_);
        auVar142._20_4_ = fVar206;
        fVar211 = (float)((uint)((byte)(uVar108 >> 6) & 1) * auVar137._24_4_);
        auVar142._24_4_ = fVar211;
        iVar1 = (uint)(byte)(uVar108 >> 7) * auVar137._28_4_;
        auVar142._28_4_ = iVar1;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar119),auVar136);
        auVar143._0_4_ =
             (uint)(bVar107 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar107 & 1) * auVar9._0_4_;
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar143._4_4_ = (uint)bVar22 * auVar125._4_4_ | (uint)!bVar22 * auVar9._4_4_;
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar143._8_4_ = (uint)bVar22 * auVar125._8_4_ | (uint)!bVar22 * auVar9._8_4_;
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar143._12_4_ = (uint)bVar22 * auVar125._12_4_ | (uint)!bVar22 * auVar9._12_4_;
        auVar143._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * auVar125._16_4_;
        auVar143._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * auVar125._20_4_;
        auVar143._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * auVar125._24_4_;
        auVar143._28_4_ = (uint)(byte)(uVar108 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar120),ZEXT1632(auVar243));
        auVar144._0_4_ =
             (float)((uint)(bVar107 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar107 & 1) * auVar118._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar144._4_4_ = (float)((uint)bVar22 * auVar125._4_4_ | (uint)!bVar22 * auVar118._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar144._8_4_ = (float)((uint)bVar22 * auVar125._8_4_ | (uint)!bVar22 * auVar118._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar144._12_4_ = (float)((uint)bVar22 * auVar125._12_4_ | (uint)!bVar22 * auVar118._12_4_);
        fVar212 = (float)((uint)((byte)(uVar108 >> 4) & 1) * auVar125._16_4_);
        auVar144._16_4_ = fVar212;
        fVar198 = (float)((uint)((byte)(uVar108 >> 5) & 1) * auVar125._20_4_);
        auVar144._20_4_ = fVar198;
        fVar205 = (float)((uint)((byte)(uVar108 >> 6) & 1) * auVar125._24_4_);
        auVar144._24_4_ = fVar205;
        auVar144._28_4_ = (uint)(byte)(uVar108 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(auVar127,ZEXT1632(auVar8));
        auVar145._0_4_ =
             (float)((uint)(bVar107 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar107 & 1) * auVar137._0_4_);
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar145._4_4_ = (float)((uint)bVar22 * auVar125._4_4_ | (uint)!bVar22 * auVar137._4_4_);
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar145._8_4_ = (float)((uint)bVar22 * auVar125._8_4_ | (uint)!bVar22 * auVar137._8_4_);
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar145._12_4_ = (float)((uint)bVar22 * auVar125._12_4_ | (uint)!bVar22 * auVar137._12_4_);
        bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
        auVar145._16_4_ = (float)((uint)bVar22 * auVar125._16_4_ | (uint)!bVar22 * auVar137._16_4_);
        bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
        auVar145._20_4_ = (float)((uint)bVar22 * auVar125._20_4_ | (uint)!bVar22 * auVar137._20_4_);
        bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
        auVar145._24_4_ = (float)((uint)bVar22 * auVar125._24_4_ | (uint)!bVar22 * auVar137._24_4_);
        bVar22 = SUB81(uVar108 >> 7,0);
        auVar145._28_4_ = (uint)bVar22 * auVar125._28_4_ | (uint)!bVar22 * auVar137._28_4_;
        auVar146._0_4_ =
             (uint)(bVar107 & 1) * (int)auVar119._0_4_ | (uint)!(bool)(bVar107 & 1) * auVar136._0_4_
        ;
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar146._4_4_ = (uint)bVar22 * (int)auVar119._4_4_ | (uint)!bVar22 * auVar136._4_4_;
        bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar146._8_4_ = (uint)bVar22 * (int)auVar119._8_4_ | (uint)!bVar22 * auVar136._8_4_;
        bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar146._12_4_ = (uint)bVar22 * (int)auVar119._12_4_ | (uint)!bVar22 * auVar136._12_4_;
        auVar146._16_4_ = (uint)!(bool)((byte)(uVar108 >> 4) & 1) * auVar136._16_4_;
        auVar146._20_4_ = (uint)!(bool)((byte)(uVar108 >> 5) & 1) * auVar136._20_4_;
        auVar146._24_4_ = (uint)!(bool)((byte)(uVar108 >> 6) & 1) * auVar136._24_4_;
        auVar146._28_4_ = (uint)!SUB81(uVar108 >> 7,0) * auVar136._28_4_;
        bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
        bVar24 = (bool)((byte)(uVar108 >> 2) & 1);
        bVar25 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar147._0_4_ =
             (uint)(bVar107 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar107 & 1) * auVar8._0_4_;
        bVar23 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar147._4_4_ = (uint)bVar23 * auVar127._4_4_ | (uint)!bVar23 * auVar8._4_4_;
        bVar23 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar147._8_4_ = (uint)bVar23 * auVar127._8_4_ | (uint)!bVar23 * auVar8._8_4_;
        bVar23 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar147._12_4_ = (uint)bVar23 * auVar127._12_4_ | (uint)!bVar23 * auVar8._12_4_;
        auVar147._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * auVar127._16_4_;
        auVar147._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * auVar127._20_4_;
        auVar147._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * auVar127._24_4_;
        iVar2 = (uint)(byte)(uVar108 >> 7) * auVar127._28_4_;
        auVar147._28_4_ = iVar2;
        auVar130 = vsubps_avx512vl(auVar146,auVar135);
        auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar25 * (int)auVar120._12_4_ |
                                                 (uint)!bVar25 * auVar243._12_4_,
                                                 CONCAT48((uint)bVar24 * (int)auVar120._8_4_ |
                                                          (uint)!bVar24 * auVar243._8_4_,
                                                          CONCAT44((uint)bVar22 *
                                                                   (int)auVar120._4_4_ |
                                                                   (uint)!bVar22 * auVar243._4_4_,
                                                                   (uint)(bVar107 & 1) *
                                                                   (int)auVar120._0_4_ |
                                                                   (uint)!(bool)(bVar107 & 1) *
                                                                   auVar243._0_4_)))),auVar129);
        auVar137 = vsubps_avx(auVar147,auVar142);
        auVar136 = vsubps_avx(auVar135,auVar143);
        auVar127 = vsubps_avx(auVar129,auVar144);
        auVar128 = vsubps_avx(auVar142,auVar145);
        auVar60._4_4_ = auVar137._4_4_ * fVar164;
        auVar60._0_4_ = auVar137._0_4_ * fVar115;
        auVar60._8_4_ = auVar137._8_4_ * fVar165;
        auVar60._12_4_ = auVar137._12_4_ * fVar168;
        auVar60._16_4_ = auVar137._16_4_ * 0.0;
        auVar60._20_4_ = auVar137._20_4_ * 0.0;
        auVar60._24_4_ = auVar137._24_4_ * 0.0;
        auVar60._28_4_ = iVar2;
        auVar117 = vfmsub231ps_fma(auVar60,auVar142,auVar130);
        auVar61._4_4_ = fVar197 * auVar130._4_4_;
        auVar61._0_4_ = fVar116 * auVar130._0_4_;
        auVar61._8_4_ = fVar166 * auVar130._8_4_;
        auVar61._12_4_ = fVar169 * auVar130._12_4_;
        auVar61._16_4_ = auVar130._16_4_ * 0.0;
        auVar61._20_4_ = auVar130._20_4_ * 0.0;
        auVar61._24_4_ = auVar130._24_4_ * 0.0;
        auVar61._28_4_ = auVar126._28_4_;
        auVar118 = vfmsub231ps_fma(auVar61,auVar135,auVar125);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),auVar133,ZEXT1632(auVar117));
        auVar207._0_4_ = auVar125._0_4_ * auVar142._0_4_;
        auVar207._4_4_ = auVar125._4_4_ * auVar142._4_4_;
        auVar207._8_4_ = auVar125._8_4_ * auVar142._8_4_;
        auVar207._12_4_ = auVar125._12_4_ * auVar142._12_4_;
        auVar207._16_4_ = auVar125._16_4_ * fVar172;
        auVar207._20_4_ = auVar125._20_4_ * fVar206;
        auVar207._24_4_ = auVar125._24_4_ * fVar211;
        auVar207._28_4_ = 0;
        auVar117 = vfmsub231ps_fma(auVar207,auVar129,auVar137);
        auVar124 = vfmadd231ps_avx512vl(auVar126,auVar133,ZEXT1632(auVar117));
        auVar126 = vmulps_avx512vl(auVar128,auVar143);
        auVar126 = vfmsub231ps_avx512vl(auVar126,auVar136,auVar145);
        auVar62._4_4_ = auVar127._4_4_ * auVar145._4_4_;
        auVar62._0_4_ = auVar127._0_4_ * auVar145._0_4_;
        auVar62._8_4_ = auVar127._8_4_ * auVar145._8_4_;
        auVar62._12_4_ = auVar127._12_4_ * auVar145._12_4_;
        auVar62._16_4_ = auVar127._16_4_ * auVar145._16_4_;
        auVar62._20_4_ = auVar127._20_4_ * auVar145._20_4_;
        auVar62._24_4_ = auVar127._24_4_ * auVar145._24_4_;
        auVar62._28_4_ = auVar145._28_4_;
        auVar117 = vfmsub231ps_fma(auVar62,auVar144,auVar128);
        auVar208._0_4_ = auVar144._0_4_ * auVar136._0_4_;
        auVar208._4_4_ = auVar144._4_4_ * auVar136._4_4_;
        auVar208._8_4_ = auVar144._8_4_ * auVar136._8_4_;
        auVar208._12_4_ = auVar144._12_4_ * auVar136._12_4_;
        auVar208._16_4_ = fVar212 * auVar136._16_4_;
        auVar208._20_4_ = fVar198 * auVar136._20_4_;
        auVar208._24_4_ = fVar205 * auVar136._24_4_;
        auVar208._28_4_ = 0;
        auVar118 = vfmsub231ps_fma(auVar208,auVar127,auVar143);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),auVar133,auVar126);
        auVar132 = vfmadd231ps_avx512vl(auVar126,auVar133,ZEXT1632(auVar117));
        auVar126 = vmaxps_avx(auVar124,auVar132);
        uVar174 = vcmpps_avx512vl(auVar126,auVar133,2);
        bVar114 = bVar114 & (byte)uVar174;
        auVar242 = ZEXT3264(local_760);
        auVar245 = ZEXT3264(local_780);
        auVar246 = ZEXT3264(local_700);
        auVar247 = ZEXT3264(local_7a0);
        auVar248 = ZEXT3264(local_7c0);
        auVar187 = ZEXT3264(local_720);
        auVar236 = ZEXT1664(local_910);
        if (bVar114 == 0) {
          bVar114 = 0;
        }
        else {
          auVar63._4_4_ = auVar128._4_4_ * auVar125._4_4_;
          auVar63._0_4_ = auVar128._0_4_ * auVar125._0_4_;
          auVar63._8_4_ = auVar128._8_4_ * auVar125._8_4_;
          auVar63._12_4_ = auVar128._12_4_ * auVar125._12_4_;
          auVar63._16_4_ = auVar128._16_4_ * auVar125._16_4_;
          auVar63._20_4_ = auVar128._20_4_ * auVar125._20_4_;
          auVar63._24_4_ = auVar128._24_4_ * auVar125._24_4_;
          auVar63._28_4_ = auVar126._28_4_;
          auVar243 = vfmsub231ps_fma(auVar63,auVar127,auVar137);
          auVar64._4_4_ = auVar137._4_4_ * auVar136._4_4_;
          auVar64._0_4_ = auVar137._0_4_ * auVar136._0_4_;
          auVar64._8_4_ = auVar137._8_4_ * auVar136._8_4_;
          auVar64._12_4_ = auVar137._12_4_ * auVar136._12_4_;
          auVar64._16_4_ = auVar137._16_4_ * auVar136._16_4_;
          auVar64._20_4_ = auVar137._20_4_ * auVar136._20_4_;
          auVar64._24_4_ = auVar137._24_4_ * auVar136._24_4_;
          auVar64._28_4_ = auVar137._28_4_;
          auVar118 = vfmsub231ps_fma(auVar64,auVar130,auVar128);
          auVar65._4_4_ = auVar127._4_4_ * auVar130._4_4_;
          auVar65._0_4_ = auVar127._0_4_ * auVar130._0_4_;
          auVar65._8_4_ = auVar127._8_4_ * auVar130._8_4_;
          auVar65._12_4_ = auVar127._12_4_ * auVar130._12_4_;
          auVar65._16_4_ = auVar127._16_4_ * auVar130._16_4_;
          auVar65._20_4_ = auVar127._20_4_ * auVar130._20_4_;
          auVar65._24_4_ = auVar127._24_4_ * auVar130._24_4_;
          auVar65._28_4_ = auVar127._28_4_;
          auVar8 = vfmsub231ps_fma(auVar65,auVar136,auVar125);
          auVar117 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar118),ZEXT1632(auVar8));
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),ZEXT1632(auVar243),auVar133);
          auVar125 = vrcp14ps_avx512vl(auVar126);
          auVar40._8_4_ = 0x3f800000;
          auVar40._0_8_ = &DAT_3f8000003f800000;
          auVar40._12_4_ = 0x3f800000;
          auVar40._16_4_ = 0x3f800000;
          auVar40._20_4_ = 0x3f800000;
          auVar40._24_4_ = 0x3f800000;
          auVar40._28_4_ = 0x3f800000;
          auVar137 = vfnmadd213ps_avx512vl(auVar125,auVar126,auVar40);
          auVar117 = vfmadd132ps_fma(auVar137,auVar125,auVar125);
          auVar66._4_4_ = auVar8._4_4_ * auVar142._4_4_;
          auVar66._0_4_ = auVar8._0_4_ * auVar142._0_4_;
          auVar66._8_4_ = auVar8._8_4_ * auVar142._8_4_;
          auVar66._12_4_ = auVar8._12_4_ * auVar142._12_4_;
          auVar66._16_4_ = fVar172 * 0.0;
          auVar66._20_4_ = fVar206 * 0.0;
          auVar66._24_4_ = fVar211 * 0.0;
          auVar66._28_4_ = iVar1;
          auVar118 = vfmadd231ps_fma(auVar66,auVar129,ZEXT1632(auVar118));
          auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar135,ZEXT1632(auVar243));
          fVar206 = auVar117._0_4_;
          fVar172 = auVar117._4_4_;
          fVar211 = auVar117._8_4_;
          fVar212 = auVar117._12_4_;
          auVar125 = ZEXT1632(CONCAT412(auVar118._12_4_ * fVar212,
                                        CONCAT48(auVar118._8_4_ * fVar211,
                                                 CONCAT44(auVar118._4_4_ * fVar172,
                                                          auVar118._0_4_ * fVar206))));
          auVar223._4_4_ = uVar173;
          auVar223._0_4_ = uVar173;
          auVar223._8_4_ = uVar173;
          auVar223._12_4_ = uVar173;
          auVar223._16_4_ = uVar173;
          auVar223._20_4_ = uVar173;
          auVar223._24_4_ = uVar173;
          auVar223._28_4_ = uVar173;
          uVar174 = vcmpps_avx512vl(auVar223,auVar125,2);
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar41._4_4_ = uVar4;
          auVar41._0_4_ = uVar4;
          auVar41._8_4_ = uVar4;
          auVar41._12_4_ = uVar4;
          auVar41._16_4_ = uVar4;
          auVar41._20_4_ = uVar4;
          auVar41._24_4_ = uVar4;
          auVar41._28_4_ = uVar4;
          uVar36 = vcmpps_avx512vl(auVar125,auVar41,2);
          bVar114 = (byte)uVar174 & (byte)uVar36 & bVar114;
          if (bVar114 != 0) {
            uVar174 = vcmpps_avx512vl(auVar126,auVar133,4);
            if ((bVar114 & (byte)uVar174) != 0) {
              bVar114 = bVar114 & (byte)uVar174;
              fVar198 = auVar124._0_4_ * fVar206;
              fVar205 = auVar124._4_4_ * fVar172;
              auVar67._4_4_ = fVar205;
              auVar67._0_4_ = fVar198;
              fVar115 = auVar124._8_4_ * fVar211;
              auVar67._8_4_ = fVar115;
              fVar116 = auVar124._12_4_ * fVar212;
              auVar67._12_4_ = fVar116;
              fVar164 = auVar124._16_4_ * 0.0;
              auVar67._16_4_ = fVar164;
              fVar197 = auVar124._20_4_ * 0.0;
              auVar67._20_4_ = fVar197;
              fVar165 = auVar124._24_4_ * 0.0;
              auVar67._24_4_ = fVar165;
              auVar67._28_4_ = auVar124._28_4_;
              fVar206 = auVar132._0_4_ * fVar206;
              fVar172 = auVar132._4_4_ * fVar172;
              auVar68._4_4_ = fVar172;
              auVar68._0_4_ = fVar206;
              fVar211 = auVar132._8_4_ * fVar211;
              auVar68._8_4_ = fVar211;
              fVar212 = auVar132._12_4_ * fVar212;
              auVar68._12_4_ = fVar212;
              fVar166 = auVar132._16_4_ * 0.0;
              auVar68._16_4_ = fVar166;
              fVar168 = auVar132._20_4_ * 0.0;
              auVar68._20_4_ = fVar168;
              fVar169 = auVar132._24_4_ * 0.0;
              auVar68._24_4_ = fVar169;
              auVar68._28_4_ = auVar132._28_4_;
              auVar219._8_4_ = 0x3f800000;
              auVar219._0_8_ = &DAT_3f8000003f800000;
              auVar219._12_4_ = 0x3f800000;
              auVar219._16_4_ = 0x3f800000;
              auVar219._20_4_ = 0x3f800000;
              auVar219._24_4_ = 0x3f800000;
              auVar219._28_4_ = 0x3f800000;
              auVar126 = vsubps_avx(auVar219,auVar67);
              local_860._0_4_ =
                   (uint)(bVar107 & 1) * (int)fVar198 | (uint)!(bool)(bVar107 & 1) * auVar126._0_4_;
              bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
              local_860._4_4_ = (uint)bVar22 * (int)fVar205 | (uint)!bVar22 * auVar126._4_4_;
              bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
              local_860._8_4_ = (uint)bVar22 * (int)fVar115 | (uint)!bVar22 * auVar126._8_4_;
              bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
              local_860._12_4_ = (uint)bVar22 * (int)fVar116 | (uint)!bVar22 * auVar126._12_4_;
              bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
              local_860._16_4_ = (uint)bVar22 * (int)fVar164 | (uint)!bVar22 * auVar126._16_4_;
              bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
              local_860._20_4_ = (uint)bVar22 * (int)fVar197 | (uint)!bVar22 * auVar126._20_4_;
              bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
              local_860._24_4_ = (uint)bVar22 * (int)fVar165 | (uint)!bVar22 * auVar126._24_4_;
              bVar22 = SUB81(uVar108 >> 7,0);
              local_860._28_4_ = (uint)bVar22 * auVar124._28_4_ | (uint)!bVar22 * auVar126._28_4_;
              auVar126 = vsubps_avx(auVar219,auVar68);
              local_4e0._0_4_ =
                   (uint)(bVar107 & 1) * (int)fVar206 | (uint)!(bool)(bVar107 & 1) * auVar126._0_4_;
              bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
              local_4e0._4_4_ = (uint)bVar22 * (int)fVar172 | (uint)!bVar22 * auVar126._4_4_;
              bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
              local_4e0._8_4_ = (uint)bVar22 * (int)fVar211 | (uint)!bVar22 * auVar126._8_4_;
              bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
              local_4e0._12_4_ = (uint)bVar22 * (int)fVar212 | (uint)!bVar22 * auVar126._12_4_;
              bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
              local_4e0._16_4_ = (uint)bVar22 * (int)fVar166 | (uint)!bVar22 * auVar126._16_4_;
              bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
              local_4e0._20_4_ = (uint)bVar22 * (int)fVar168 | (uint)!bVar22 * auVar126._20_4_;
              bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
              local_4e0._24_4_ = (uint)bVar22 * (int)fVar169 | (uint)!bVar22 * auVar126._24_4_;
              bVar22 = SUB81(uVar108 >> 7,0);
              local_4e0._28_4_ = (uint)bVar22 * auVar132._28_4_ | (uint)!bVar22 * auVar126._28_4_;
              local_880 = auVar125;
              goto LAB_01eedb65;
            }
          }
          bVar114 = 0;
        }
LAB_01eedb65:
        auVar250 = ZEXT3264(auVar131);
        if (bVar114 != 0) {
          auVar126 = vsubps_avx(ZEXT1632(auVar175),auVar122);
          auVar117 = vfmadd213ps_fma(auVar126,local_860,auVar122);
          uVar4 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar42._4_4_ = uVar4;
          auVar42._0_4_ = uVar4;
          auVar42._8_4_ = uVar4;
          auVar42._12_4_ = uVar4;
          auVar42._16_4_ = uVar4;
          auVar42._20_4_ = uVar4;
          auVar42._24_4_ = uVar4;
          auVar42._28_4_ = uVar4;
          auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar117._12_4_ + auVar117._12_4_,
                                                        CONCAT48(auVar117._8_4_ + auVar117._8_4_,
                                                                 CONCAT44(auVar117._4_4_ +
                                                                          auVar117._4_4_,
                                                                          auVar117._0_4_ +
                                                                          auVar117._0_4_)))),auVar42
                                    );
          uVar174 = vcmpps_avx512vl(local_880,auVar126,6);
          bVar114 = bVar114 & (byte)uVar174;
          if (bVar114 != 0) {
            auVar181._8_4_ = 0xbf800000;
            auVar181._0_8_ = 0xbf800000bf800000;
            auVar181._12_4_ = 0xbf800000;
            auVar181._16_4_ = 0xbf800000;
            auVar181._20_4_ = 0xbf800000;
            auVar181._24_4_ = 0xbf800000;
            auVar181._28_4_ = 0xbf800000;
            auVar43._8_4_ = 0x40000000;
            auVar43._0_8_ = 0x4000000040000000;
            auVar43._12_4_ = 0x40000000;
            auVar43._16_4_ = 0x40000000;
            auVar43._20_4_ = 0x40000000;
            auVar43._24_4_ = 0x40000000;
            auVar43._28_4_ = 0x40000000;
            local_680 = vfmadd132ps_avx512vl(local_4e0,auVar181,auVar43);
            local_4e0 = local_680;
            auVar126 = local_4e0;
            local_640 = 0;
            local_630 = local_960;
            uStack_628 = uStack_958;
            local_620 = local_8e0._0_8_;
            uStack_618 = local_8e0._8_8_;
            local_610 = local_8f0._0_8_;
            uStack_608 = local_8f0._8_8_;
            local_600 = local_8d0;
            uStack_5f8 = uStack_8c8;
            local_4e0 = auVar126;
            if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar206 = 1.0 / auVar226._0_4_;
              local_5e0[0] = fVar206 * (local_860._0_4_ + 0.0);
              local_5e0[1] = fVar206 * (local_860._4_4_ + 1.0);
              local_5e0[2] = fVar206 * (local_860._8_4_ + 2.0);
              local_5e0[3] = fVar206 * (local_860._12_4_ + 3.0);
              fStack_5d0 = fVar206 * (local_860._16_4_ + 4.0);
              fStack_5cc = fVar206 * (local_860._20_4_ + 5.0);
              fStack_5c8 = fVar206 * (local_860._24_4_ + 6.0);
              fStack_5c4 = local_860._28_4_ + 7.0;
              local_4e0._0_8_ = local_680._0_8_;
              local_4e0._8_8_ = local_680._8_8_;
              local_4e0._16_8_ = local_680._16_8_;
              local_4e0._24_8_ = local_680._24_8_;
              local_5c0 = local_4e0._0_8_;
              uStack_5b8 = local_4e0._8_8_;
              uStack_5b0 = local_4e0._16_8_;
              uStack_5a8 = local_4e0._24_8_;
              local_5a0 = local_880;
              auVar182._8_4_ = 0x7f800000;
              auVar182._0_8_ = 0x7f8000007f800000;
              auVar182._12_4_ = 0x7f800000;
              auVar182._16_4_ = 0x7f800000;
              auVar182._20_4_ = 0x7f800000;
              auVar182._24_4_ = 0x7f800000;
              auVar182._28_4_ = 0x7f800000;
              auVar126 = vblendmps_avx512vl(auVar182,local_880);
              auVar148._0_4_ =
                   (uint)(bVar114 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar114 & 1) * 0x7f800000;
              bVar22 = (bool)(bVar114 >> 1 & 1);
              auVar148._4_4_ = (uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar114 >> 2 & 1);
              auVar148._8_4_ = (uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar114 >> 3 & 1);
              auVar148._12_4_ = (uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar114 >> 4 & 1);
              auVar148._16_4_ = (uint)bVar22 * auVar126._16_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar114 >> 5 & 1);
              auVar148._20_4_ = (uint)bVar22 * auVar126._20_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar114 >> 6 & 1);
              auVar148._24_4_ = (uint)bVar22 * auVar126._24_4_ | (uint)!bVar22 * 0x7f800000;
              auVar148._28_4_ =
                   (uint)(bVar114 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar114 >> 7) * 0x7f800000
              ;
              auVar126 = vshufps_avx(auVar148,auVar148,0xb1);
              auVar126 = vminps_avx(auVar148,auVar126);
              auVar125 = vshufpd_avx(auVar126,auVar126,5);
              auVar126 = vminps_avx(auVar126,auVar125);
              auVar125 = vpermpd_avx2(auVar126,0x4e);
              auVar126 = vminps_avx(auVar126,auVar125);
              uVar174 = vcmpps_avx512vl(auVar148,auVar126,0);
              bVar106 = (byte)uVar174 & bVar114;
              bVar107 = bVar114;
              if (bVar106 != 0) {
                bVar107 = bVar106;
              }
              uVar38 = 0;
              for (uVar109 = (uint)bVar107; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x80000000)
              {
                uVar38 = uVar38 + 1;
              }
              uVar108 = (ulong)uVar38;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar206 = local_5e0[uVar108];
                uVar4 = *(undefined4 *)((long)&local_5c0 + uVar108 * 4);
                fVar211 = 1.0 - fVar206;
                fVar172 = fVar211 * fVar211 * -3.0;
                auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211)),
                                           ZEXT416((uint)(fVar206 * fVar211)),ZEXT416(0xc0000000));
                auVar118 = vfmsub132ss_fma(ZEXT416((uint)(fVar206 * fVar211)),
                                           ZEXT416((uint)(fVar206 * fVar206)),ZEXT416(0x40000000));
                fVar211 = auVar117._0_4_ * 3.0;
                fVar212 = auVar118._0_4_ * 3.0;
                fVar198 = fVar206 * fVar206 * 3.0;
                auVar213._0_4_ = fVar198 * (float)local_8d0._0_4_;
                auVar213._4_4_ = fVar198 * (float)local_8d0._4_4_;
                auVar213._8_4_ = fVar198 * (float)uStack_8c8;
                auVar213._12_4_ = fVar198 * uStack_8c8._4_4_;
                auVar192._4_4_ = fVar212;
                auVar192._0_4_ = fVar212;
                auVar192._8_4_ = fVar212;
                auVar192._12_4_ = fVar212;
                auVar117 = vfmadd132ps_fma(auVar192,auVar213,local_8f0);
                auVar199._4_4_ = fVar211;
                auVar199._0_4_ = fVar211;
                auVar199._8_4_ = fVar211;
                auVar199._12_4_ = fVar211;
                auVar117 = vfmadd132ps_fma(auVar199,auVar117,local_8e0);
                auVar193._4_4_ = fVar172;
                auVar193._0_4_ = fVar172;
                auVar193._8_4_ = fVar172;
                auVar193._12_4_ = fVar172;
                auVar117 = vfmadd132ps_fma(auVar193,auVar117,auVar7);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar108 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar117._0_4_;
                uVar16 = vextractps_avx(auVar117,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar16;
                uVar16 = vextractps_avx(auVar117,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar16;
                *(float *)(ray + k * 4 + 0x3c0) = fVar206;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar4;
                *(uint *)(ray + k * 4 + 0x440) = uVar14;
                *(uint *)(ray + k * 4 + 0x480) = uVar112;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar162 = vpbroadcastd_avx512f();
                local_440 = vmovdqa64_avx512f(auVar162);
                auVar162 = vpbroadcastd_avx512f();
                local_480 = vmovdqa64_avx512f(auVar162);
                local_900 = local_8e0._0_4_;
                uStack_8fc = local_8e0._4_4_;
                uStack_8f8 = local_8e0._8_8_;
                local_820 = local_8f0._0_4_;
                uStack_81c = local_8f0._4_4_;
                uStack_818 = local_8f0._8_8_;
                local_830 = (float)local_8d0._0_4_;
                fStack_82c = (float)local_8d0._4_4_;
                fStack_828 = (float)uStack_8c8;
                fStack_824 = uStack_8c8._4_4_;
                local_800 = uVar173;
                local_7e0 = auVar131;
                local_6a0 = local_860;
                local_660 = local_880;
                local_63c = iVar15;
                local_5f0 = bVar114;
                do {
                  auVar243 = auVar244._0_16_;
                  local_520 = (float)*(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5e0[uVar108]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_5c0 + uVar108 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar108 * 4);
                  local_948.context = context->user;
                  fVar212 = local_200._0_4_;
                  fVar172 = 1.0 - fVar212;
                  fVar206 = fVar172 * fVar172 * -3.0;
                  auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar172 * fVar172)),
                                             ZEXT416((uint)(fVar212 * fVar172)),ZEXT416(0xc0000000))
                  ;
                  auVar118 = vfmsub132ss_fma(ZEXT416((uint)(fVar212 * fVar172)),
                                             ZEXT416((uint)(fVar212 * fVar212)),ZEXT416(0x40000000))
                  ;
                  fVar172 = auVar117._0_4_ * 3.0;
                  fVar211 = auVar118._0_4_ * 3.0;
                  fVar212 = fVar212 * fVar212 * 3.0;
                  auVar216._0_4_ = fVar212 * local_830;
                  auVar216._4_4_ = fVar212 * fStack_82c;
                  auVar216._8_4_ = fVar212 * fStack_828;
                  auVar216._12_4_ = fVar212 * fStack_824;
                  auVar178._4_4_ = fVar211;
                  auVar178._0_4_ = fVar211;
                  auVar178._8_4_ = fVar211;
                  auVar178._12_4_ = fVar211;
                  auVar103._4_4_ = uStack_81c;
                  auVar103._0_4_ = local_820;
                  auVar103._8_8_ = uStack_818;
                  auVar117 = vfmadd132ps_fma(auVar178,auVar216,auVar103);
                  auVar202._4_4_ = fVar172;
                  auVar202._0_4_ = fVar172;
                  auVar202._8_4_ = fVar172;
                  auVar202._12_4_ = fVar172;
                  auVar101._4_4_ = uStack_8fc;
                  auVar101._0_4_ = local_900;
                  auVar101._8_8_ = uStack_8f8;
                  auVar117 = vfmadd132ps_fma(auVar202,auVar117,auVar101);
                  auVar179._4_4_ = fVar206;
                  auVar179._0_4_ = fVar206;
                  auVar179._8_4_ = fVar206;
                  auVar179._12_4_ = fVar206;
                  auVar117 = vfmadd132ps_fma(auVar179,auVar117,auVar7);
                  auVar162 = vbroadcastss_avx512f(auVar117);
                  auVar163 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar163,ZEXT1664(auVar117));
                  auVar163 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar163,ZEXT1664(auVar117));
                  local_2c0[0] = (RTCHitN)auVar162[0];
                  local_2c0[1] = (RTCHitN)auVar162[1];
                  local_2c0[2] = (RTCHitN)auVar162[2];
                  local_2c0[3] = (RTCHitN)auVar162[3];
                  local_2c0[4] = (RTCHitN)auVar162[4];
                  local_2c0[5] = (RTCHitN)auVar162[5];
                  local_2c0[6] = (RTCHitN)auVar162[6];
                  local_2c0[7] = (RTCHitN)auVar162[7];
                  local_2c0[8] = (RTCHitN)auVar162[8];
                  local_2c0[9] = (RTCHitN)auVar162[9];
                  local_2c0[10] = (RTCHitN)auVar162[10];
                  local_2c0[0xb] = (RTCHitN)auVar162[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar162[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar162[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar162[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar162[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar162[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar162[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar162[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar162[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar162[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar162[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar162[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar162[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar162[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar162[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar162[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar162[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar162[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar162[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar162[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar162[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar162[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar162[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar162[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar162[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar162[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar162[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar162[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar162[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar162[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar162[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar162[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar162[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar162[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar162[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar162[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar162[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar162[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar162[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar162[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar162[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar162[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar162[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar162[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar162[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar162[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar162[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar162[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar162[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar162[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar162[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar162[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar162[0x3f];
                  local_180 = local_480._0_8_;
                  uStack_178 = local_480._8_8_;
                  uStack_170 = local_480._16_8_;
                  uStack_168 = local_480._24_8_;
                  uStack_160 = local_480._32_8_;
                  uStack_158 = local_480._40_8_;
                  uStack_150 = local_480._48_8_;
                  uStack_148 = local_480._56_8_;
                  auVar162 = vmovdqa64_avx512f(local_440);
                  local_140 = vmovdqa64_avx512f(auVar162);
                  auVar126 = vpcmpeqd_avx2(auVar162._0_32_,auVar162._0_32_);
                  local_918[3] = auVar126;
                  local_918[2] = auVar126;
                  local_918[1] = auVar126;
                  *local_918 = auVar126;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_948.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_948.context)->instPrimID[0]));
                  local_580 = local_300;
                  local_948.valid = (int *)local_580;
                  local_948.geometryUserPtr = pGVar17->userPtr;
                  local_948.hit = local_2c0;
                  local_948.N = 0x10;
                  local_6c0 = (undefined4)uVar108;
                  uStack_6bc = (undefined4)(uVar108 >> 0x20);
                  local_948.ray = (RTCRayN *)ray;
                  if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar17->intersectionFilterN)(&local_948);
                    uVar108 = CONCAT44(uStack_6bc,local_6c0);
                    auVar236 = ZEXT1664(local_910);
                    auVar250 = ZEXT3264(local_7e0);
                    auVar249 = ZEXT3264(local_740);
                    auVar187 = ZEXT3264(local_720);
                    auVar248 = ZEXT3264(local_7c0);
                    auVar247 = ZEXT3264(local_7a0);
                    auVar246 = ZEXT3264(local_700);
                    auVar245 = ZEXT3264(local_780);
                    auVar241 = ZEXT3264(local_6e0);
                    auVar242 = ZEXT3264(local_760);
                    auVar117 = vxorps_avx512vl(auVar243,auVar243);
                    auVar244 = ZEXT1664(auVar117);
                    uVar173 = local_800;
                  }
                  auVar117 = auVar244._0_16_;
                  auVar162 = vmovdqa64_avx512f(local_580);
                  uVar174 = vptestmd_avx512f(auVar162,auVar162);
                  if ((short)uVar174 == 0) {
LAB_01eef222:
                    *(float *)(ray + k * 4 + 0x200) = local_520;
                  }
                  else {
                    p_Var21 = context->args->filter;
                    if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var21)(&local_948);
                      uVar108 = CONCAT44(uStack_6bc,local_6c0);
                      auVar236 = ZEXT1664(local_910);
                      auVar250 = ZEXT3264(local_7e0);
                      auVar249 = ZEXT3264(local_740);
                      auVar187 = ZEXT3264(local_720);
                      auVar248 = ZEXT3264(local_7c0);
                      auVar247 = ZEXT3264(local_7a0);
                      auVar246 = ZEXT3264(local_700);
                      auVar245 = ZEXT3264(local_780);
                      auVar241 = ZEXT3264(local_6e0);
                      auVar242 = ZEXT3264(local_760);
                      auVar117 = vxorps_avx512vl(auVar117,auVar117);
                      auVar244 = ZEXT1664(auVar117);
                      uVar173 = local_800;
                    }
                    auVar162 = vmovdqa64_avx512f(local_580);
                    uVar37 = vptestmd_avx512f(auVar162,auVar162);
                    if ((short)uVar37 == 0) goto LAB_01eef222;
                    iVar1 = *(int *)(local_948.hit + 4);
                    iVar2 = *(int *)(local_948.hit + 8);
                    iVar88 = *(int *)(local_948.hit + 0xc);
                    iVar89 = *(int *)(local_948.hit + 0x10);
                    iVar90 = *(int *)(local_948.hit + 0x14);
                    iVar91 = *(int *)(local_948.hit + 0x18);
                    iVar92 = *(int *)(local_948.hit + 0x1c);
                    iVar93 = *(int *)(local_948.hit + 0x20);
                    iVar94 = *(int *)(local_948.hit + 0x24);
                    iVar95 = *(int *)(local_948.hit + 0x28);
                    iVar96 = *(int *)(local_948.hit + 0x2c);
                    iVar97 = *(int *)(local_948.hit + 0x30);
                    iVar98 = *(int *)(local_948.hit + 0x34);
                    iVar99 = *(int *)(local_948.hit + 0x38);
                    iVar100 = *(int *)(local_948.hit + 0x3c);
                    bVar107 = (byte)uVar37;
                    bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                    bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                    bVar106 = (byte)(uVar37 >> 8);
                    bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                    bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                    bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                    bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                    bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                    bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                    bVar35 = SUB81(uVar37 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x300) =
                         (uint)(bVar107 & 1) * *(int *)local_948.hit |
                         (uint)!(bool)(bVar107 & 1) * *(int *)(local_948.ray + 0x300);
                    *(uint *)(local_948.ray + 0x304) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 0x304);
                    *(uint *)(local_948.ray + 0x308) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x308);
                    *(uint *)(local_948.ray + 0x30c) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x30c);
                    *(uint *)(local_948.ray + 0x310) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x310);
                    *(uint *)(local_948.ray + 0x314) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x314);
                    *(uint *)(local_948.ray + 0x318) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x318);
                    *(uint *)(local_948.ray + 0x31c) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x31c);
                    *(uint *)(local_948.ray + 800) =
                         (uint)(bVar106 & 1) * iVar93 |
                         (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 800);
                    *(uint *)(local_948.ray + 0x324) =
                         (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x324);
                    *(uint *)(local_948.ray + 0x328) =
                         (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 0x328);
                    *(uint *)(local_948.ray + 0x32c) =
                         (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x32c);
                    *(uint *)(local_948.ray + 0x330) =
                         (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x330);
                    *(uint *)(local_948.ray + 0x334) =
                         (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x334);
                    *(uint *)(local_948.ray + 0x338) =
                         (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x338);
                    *(uint *)(local_948.ray + 0x33c) =
                         (uint)bVar35 * iVar100 | (uint)!bVar35 * *(int *)(local_948.ray + 0x33c);
                    iVar1 = *(int *)(local_948.hit + 0x44);
                    iVar2 = *(int *)(local_948.hit + 0x48);
                    iVar88 = *(int *)(local_948.hit + 0x4c);
                    iVar89 = *(int *)(local_948.hit + 0x50);
                    iVar90 = *(int *)(local_948.hit + 0x54);
                    iVar91 = *(int *)(local_948.hit + 0x58);
                    iVar92 = *(int *)(local_948.hit + 0x5c);
                    iVar93 = *(int *)(local_948.hit + 0x60);
                    iVar94 = *(int *)(local_948.hit + 100);
                    iVar95 = *(int *)(local_948.hit + 0x68);
                    iVar96 = *(int *)(local_948.hit + 0x6c);
                    iVar97 = *(int *)(local_948.hit + 0x70);
                    iVar98 = *(int *)(local_948.hit + 0x74);
                    iVar99 = *(int *)(local_948.hit + 0x78);
                    iVar100 = *(int *)(local_948.hit + 0x7c);
                    bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                    bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                    bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                    bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                    bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                    bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                    bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                    bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                    bVar35 = SUB81(uVar37 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x340) =
                         (uint)(bVar107 & 1) * *(int *)(local_948.hit + 0x40) |
                         (uint)!(bool)(bVar107 & 1) * *(int *)(local_948.ray + 0x340);
                    *(uint *)(local_948.ray + 0x344) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 0x344);
                    *(uint *)(local_948.ray + 0x348) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x348);
                    *(uint *)(local_948.ray + 0x34c) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x34c);
                    *(uint *)(local_948.ray + 0x350) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x350);
                    *(uint *)(local_948.ray + 0x354) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x354);
                    *(uint *)(local_948.ray + 0x358) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x358);
                    *(uint *)(local_948.ray + 0x35c) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x35c);
                    *(uint *)(local_948.ray + 0x360) =
                         (uint)(bVar106 & 1) * iVar93 |
                         (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 0x360);
                    *(uint *)(local_948.ray + 0x364) =
                         (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x364);
                    *(uint *)(local_948.ray + 0x368) =
                         (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 0x368);
                    *(uint *)(local_948.ray + 0x36c) =
                         (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x36c);
                    *(uint *)(local_948.ray + 0x370) =
                         (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x370);
                    *(uint *)(local_948.ray + 0x374) =
                         (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x374);
                    *(uint *)(local_948.ray + 0x378) =
                         (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x378);
                    *(uint *)(local_948.ray + 0x37c) =
                         (uint)bVar35 * iVar100 | (uint)!bVar35 * *(int *)(local_948.ray + 0x37c);
                    iVar1 = *(int *)(local_948.hit + 0x84);
                    iVar2 = *(int *)(local_948.hit + 0x88);
                    iVar88 = *(int *)(local_948.hit + 0x8c);
                    iVar89 = *(int *)(local_948.hit + 0x90);
                    iVar90 = *(int *)(local_948.hit + 0x94);
                    iVar91 = *(int *)(local_948.hit + 0x98);
                    iVar92 = *(int *)(local_948.hit + 0x9c);
                    iVar93 = *(int *)(local_948.hit + 0xa0);
                    iVar94 = *(int *)(local_948.hit + 0xa4);
                    iVar95 = *(int *)(local_948.hit + 0xa8);
                    iVar96 = *(int *)(local_948.hit + 0xac);
                    iVar97 = *(int *)(local_948.hit + 0xb0);
                    iVar98 = *(int *)(local_948.hit + 0xb4);
                    iVar99 = *(int *)(local_948.hit + 0xb8);
                    iVar100 = *(int *)(local_948.hit + 0xbc);
                    bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                    bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                    bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                    bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                    bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                    bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                    bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                    bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                    bVar35 = SUB81(uVar37 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x380) =
                         (uint)(bVar107 & 1) * *(int *)(local_948.hit + 0x80) |
                         (uint)!(bool)(bVar107 & 1) * *(int *)(local_948.ray + 0x380);
                    *(uint *)(local_948.ray + 900) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 900);
                    *(uint *)(local_948.ray + 0x388) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x388);
                    *(uint *)(local_948.ray + 0x38c) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x38c);
                    *(uint *)(local_948.ray + 0x390) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x390);
                    *(uint *)(local_948.ray + 0x394) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x394);
                    *(uint *)(local_948.ray + 0x398) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x398);
                    *(uint *)(local_948.ray + 0x39c) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x39c);
                    *(uint *)(local_948.ray + 0x3a0) =
                         (uint)(bVar106 & 1) * iVar93 |
                         (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 0x3a0);
                    *(uint *)(local_948.ray + 0x3a4) =
                         (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x3a4);
                    *(uint *)(local_948.ray + 0x3a8) =
                         (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 0x3a8);
                    *(uint *)(local_948.ray + 0x3ac) =
                         (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x3ac);
                    *(uint *)(local_948.ray + 0x3b0) =
                         (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x3b0);
                    *(uint *)(local_948.ray + 0x3b4) =
                         (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x3b4);
                    *(uint *)(local_948.ray + 0x3b8) =
                         (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x3b8);
                    *(uint *)(local_948.ray + 0x3bc) =
                         (uint)bVar35 * iVar100 | (uint)!bVar35 * *(int *)(local_948.ray + 0x3bc);
                    iVar1 = *(int *)(local_948.hit + 0xc4);
                    iVar2 = *(int *)(local_948.hit + 200);
                    iVar88 = *(int *)(local_948.hit + 0xcc);
                    iVar89 = *(int *)(local_948.hit + 0xd0);
                    iVar90 = *(int *)(local_948.hit + 0xd4);
                    iVar91 = *(int *)(local_948.hit + 0xd8);
                    iVar92 = *(int *)(local_948.hit + 0xdc);
                    iVar93 = *(int *)(local_948.hit + 0xe0);
                    iVar94 = *(int *)(local_948.hit + 0xe4);
                    iVar95 = *(int *)(local_948.hit + 0xe8);
                    iVar96 = *(int *)(local_948.hit + 0xec);
                    iVar97 = *(int *)(local_948.hit + 0xf0);
                    iVar98 = *(int *)(local_948.hit + 0xf4);
                    iVar99 = *(int *)(local_948.hit + 0xf8);
                    iVar100 = *(int *)(local_948.hit + 0xfc);
                    bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                    bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                    bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                    bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                    bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                    bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                    bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                    bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                    bVar35 = SUB81(uVar37 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x3c0) =
                         (uint)(bVar107 & 1) * *(int *)(local_948.hit + 0xc0) |
                         (uint)!(bool)(bVar107 & 1) * *(int *)(local_948.ray + 0x3c0);
                    *(uint *)(local_948.ray + 0x3c4) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 0x3c4);
                    *(uint *)(local_948.ray + 0x3c8) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x3c8);
                    *(uint *)(local_948.ray + 0x3cc) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x3cc);
                    *(uint *)(local_948.ray + 0x3d0) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x3d0);
                    *(uint *)(local_948.ray + 0x3d4) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x3d4);
                    *(uint *)(local_948.ray + 0x3d8) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x3d8);
                    *(uint *)(local_948.ray + 0x3dc) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x3dc);
                    *(uint *)(local_948.ray + 0x3e0) =
                         (uint)(bVar106 & 1) * iVar93 |
                         (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 0x3e0);
                    *(uint *)(local_948.ray + 0x3e4) =
                         (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x3e4);
                    *(uint *)(local_948.ray + 1000) =
                         (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 1000);
                    *(uint *)(local_948.ray + 0x3ec) =
                         (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x3ec);
                    *(uint *)(local_948.ray + 0x3f0) =
                         (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x3f0);
                    *(uint *)(local_948.ray + 0x3f4) =
                         (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x3f4);
                    *(uint *)(local_948.ray + 0x3f8) =
                         (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x3f8);
                    *(uint *)(local_948.ray + 0x3fc) =
                         (uint)bVar35 * iVar100 | (uint)!bVar35 * *(int *)(local_948.ray + 0x3fc);
                    iVar1 = *(int *)(local_948.hit + 0x104);
                    iVar2 = *(int *)(local_948.hit + 0x108);
                    iVar88 = *(int *)(local_948.hit + 0x10c);
                    iVar89 = *(int *)(local_948.hit + 0x110);
                    iVar90 = *(int *)(local_948.hit + 0x114);
                    iVar91 = *(int *)(local_948.hit + 0x118);
                    iVar92 = *(int *)(local_948.hit + 0x11c);
                    iVar93 = *(int *)(local_948.hit + 0x120);
                    iVar94 = *(int *)(local_948.hit + 0x124);
                    iVar95 = *(int *)(local_948.hit + 0x128);
                    iVar96 = *(int *)(local_948.hit + 300);
                    iVar97 = *(int *)(local_948.hit + 0x130);
                    iVar98 = *(int *)(local_948.hit + 0x134);
                    iVar99 = *(int *)(local_948.hit + 0x138);
                    iVar100 = *(int *)(local_948.hit + 0x13c);
                    bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                    bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                    bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                    bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                    bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                    bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                    bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                    bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                    bVar35 = SUB81(uVar37 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x400) =
                         (uint)(bVar107 & 1) * *(int *)(local_948.hit + 0x100) |
                         (uint)!(bool)(bVar107 & 1) * *(int *)(local_948.ray + 0x400);
                    *(uint *)(local_948.ray + 0x404) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 0x404);
                    *(uint *)(local_948.ray + 0x408) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x408);
                    *(uint *)(local_948.ray + 0x40c) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x40c);
                    *(uint *)(local_948.ray + 0x410) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x410);
                    *(uint *)(local_948.ray + 0x414) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x414);
                    *(uint *)(local_948.ray + 0x418) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x418);
                    *(uint *)(local_948.ray + 0x41c) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x41c);
                    *(uint *)(local_948.ray + 0x420) =
                         (uint)(bVar106 & 1) * iVar93 |
                         (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 0x420);
                    *(uint *)(local_948.ray + 0x424) =
                         (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x424);
                    *(uint *)(local_948.ray + 0x428) =
                         (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 0x428);
                    *(uint *)(local_948.ray + 0x42c) =
                         (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x42c);
                    *(uint *)(local_948.ray + 0x430) =
                         (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x430);
                    *(uint *)(local_948.ray + 0x434) =
                         (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x434);
                    *(uint *)(local_948.ray + 0x438) =
                         (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x438);
                    *(uint *)(local_948.ray + 0x43c) =
                         (uint)bVar35 * iVar100 | (uint)!bVar35 * *(int *)(local_948.ray + 0x43c);
                    auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x140));
                    auVar162 = vmovdqu32_avx512f(auVar162);
                    *(undefined1 (*) [64])(local_948.ray + 0x440) = auVar162;
                    auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x180));
                    auVar162 = vmovdqu32_avx512f(auVar162);
                    *(undefined1 (*) [64])(local_948.ray + 0x480) = auVar162;
                    auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x1c0));
                    auVar162 = vmovdqa32_avx512f(auVar162);
                    *(undefined1 (*) [64])(local_948.ray + 0x4c0) = auVar162;
                    auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x200));
                    auVar162 = vmovdqa32_avx512f(auVar162);
                    *(undefined1 (*) [64])(local_948.ray + 0x500) = auVar162;
                  }
                  auVar131 = auVar250._0_32_;
                  bVar107 = ~(byte)(1 << ((uint)uVar108 & 0x1f)) & bVar114;
                  uVar234 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar50._4_4_ = uVar234;
                  auVar50._0_4_ = uVar234;
                  auVar50._8_4_ = uVar234;
                  auVar50._12_4_ = uVar234;
                  auVar50._16_4_ = uVar234;
                  auVar50._20_4_ = uVar234;
                  auVar50._24_4_ = uVar234;
                  auVar50._28_4_ = uVar234;
                  uVar174 = vcmpps_avx512vl(local_880,auVar50,2);
                  bVar114 = bVar107 & (byte)uVar174;
                  if ((bVar107 & (byte)uVar174) != 0) {
                    auVar186._8_4_ = 0x7f800000;
                    auVar186._0_8_ = 0x7f8000007f800000;
                    auVar186._12_4_ = 0x7f800000;
                    auVar186._16_4_ = 0x7f800000;
                    auVar186._20_4_ = 0x7f800000;
                    auVar186._24_4_ = 0x7f800000;
                    auVar186._28_4_ = 0x7f800000;
                    auVar126 = vblendmps_avx512vl(auVar186,local_880);
                    auVar161._0_4_ =
                         (uint)(bVar114 & 1) * auVar126._0_4_ |
                         (uint)!(bool)(bVar114 & 1) * 0x7f800000;
                    bVar22 = (bool)(bVar114 >> 1 & 1);
                    auVar161._4_4_ = (uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar114 >> 2 & 1);
                    auVar161._8_4_ = (uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar114 >> 3 & 1);
                    auVar161._12_4_ = (uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar114 >> 4 & 1);
                    auVar161._16_4_ = (uint)bVar22 * auVar126._16_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar114 >> 5 & 1);
                    auVar161._20_4_ = (uint)bVar22 * auVar126._20_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar114 >> 6 & 1);
                    auVar161._24_4_ = (uint)bVar22 * auVar126._24_4_ | (uint)!bVar22 * 0x7f800000;
                    auVar161._28_4_ =
                         (uint)(bVar114 >> 7) * auVar126._28_4_ |
                         (uint)!(bool)(bVar114 >> 7) * 0x7f800000;
                    auVar126 = vshufps_avx(auVar161,auVar161,0xb1);
                    auVar126 = vminps_avx(auVar161,auVar126);
                    auVar125 = vshufpd_avx(auVar126,auVar126,5);
                    auVar126 = vminps_avx(auVar126,auVar125);
                    auVar125 = vpermpd_avx2(auVar126,0x4e);
                    auVar126 = vminps_avx(auVar126,auVar125);
                    uVar174 = vcmpps_avx512vl(auVar161,auVar126,0);
                    bVar106 = (byte)uVar174 & bVar114;
                    bVar107 = bVar114;
                    if (bVar106 != 0) {
                      bVar107 = bVar106;
                    }
                    uVar38 = 0;
                    for (uVar109 = (uint)bVar107; (uVar109 & 1) == 0;
                        uVar109 = uVar109 >> 1 | 0x80000000) {
                      uVar38 = uVar38 + 1;
                    }
                    uVar108 = (ulong)uVar38;
                  }
                  uVar234 = auVar236._0_4_;
                } while (bVar114 != 0);
              }
            }
          }
        }
      }
      local_800 = uVar234;
      if (8 < iVar15) {
        auVar126 = vpbroadcastd_avx512vl();
        auVar250 = ZEXT3264(auVar126);
        local_520 = 1.0 / auVar226._0_4_;
        fStack_51c = local_520;
        fStack_518 = local_520;
        fStack_514 = local_520;
        fStack_510 = local_520;
        fStack_50c = local_520;
        fStack_508 = local_520;
        fStack_504 = local_520;
        auVar236 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar236);
        auVar236 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar236);
        lVar111 = 8;
        uStack_7fc = local_800;
        uStack_7f8 = local_800;
        uStack_7f4 = local_800;
        uStack_7f0 = local_800;
        uStack_7ec = local_800;
        uStack_7e8 = local_800;
        uStack_7e4 = local_800;
        local_7e0 = auVar131;
        local_6c0 = uVar173;
        uStack_6bc = uVar173;
        uStack_6b8 = uVar173;
        uStack_6b4 = uVar173;
        uStack_6b0 = uVar173;
        uStack_6ac = uVar173;
        uStack_6a8 = uVar173;
        uStack_6a4 = uVar173;
        do {
          auVar126 = vpbroadcastd_avx512vl();
          auVar127 = vpor_avx2(auVar126,_DAT_0205a920);
          uVar36 = vpcmpgtd_avx512vl(auVar250._0_32_,auVar127);
          auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar111 * 4 + lVar39);
          auVar125 = *(undefined1 (*) [32])(lVar39 + 0x2227768 + lVar111 * 4);
          auVar137 = *(undefined1 (*) [32])(lVar39 + 0x2227bec + lVar111 * 4);
          auVar136 = *(undefined1 (*) [32])(lVar39 + 0x2228070 + lVar111 * 4);
          local_720 = auVar187._0_32_;
          auVar128 = vmulps_avx512vl(local_720,auVar136);
          local_740 = auVar249._0_32_;
          auVar135 = vmulps_avx512vl(local_740,auVar136);
          auVar69._4_4_ = auVar136._4_4_ * (float)local_3a0._4_4_;
          auVar69._0_4_ = auVar136._0_4_ * (float)local_3a0._0_4_;
          auVar69._8_4_ = auVar136._8_4_ * fStack_398;
          auVar69._12_4_ = auVar136._12_4_ * fStack_394;
          auVar69._16_4_ = auVar136._16_4_ * fStack_390;
          auVar69._20_4_ = auVar136._20_4_ * fStack_38c;
          auVar69._24_4_ = auVar136._24_4_ * fStack_388;
          auVar69._28_4_ = auVar127._28_4_;
          auVar217 = auVar247._0_32_;
          auVar127 = vfmadd231ps_avx512vl(auVar128,auVar137,auVar217);
          auVar218 = auVar248._0_32_;
          auVar128 = vfmadd231ps_avx512vl(auVar135,auVar137,auVar218);
          auVar135 = vfmadd231ps_avx512vl(auVar69,auVar137,local_380);
          auVar196 = auVar245._0_32_;
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar125,auVar196);
          local_700 = auVar246._0_32_;
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,local_700);
          auVar117 = vfmadd231ps_fma(auVar135,auVar125,local_360);
          auVar189 = auVar242._0_32_;
          auVar124 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar189);
          local_6e0 = auVar241._0_32_;
          auVar132 = vfmadd231ps_avx512vl(auVar128,auVar126,local_6e0);
          auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar111 * 4 + lVar39);
          auVar128 = *(undefined1 (*) [32])(lVar39 + 0x2229b88 + lVar111 * 4);
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar126,local_340);
          auVar135 = *(undefined1 (*) [32])(lVar39 + 0x222a00c + lVar111 * 4);
          auVar129 = *(undefined1 (*) [32])(lVar39 + 0x222a490 + lVar111 * 4);
          auVar131 = vmulps_avx512vl(local_720,auVar129);
          auVar130 = vmulps_avx512vl(local_740,auVar129);
          auVar70._4_4_ = auVar129._4_4_ * (float)local_3a0._4_4_;
          auVar70._0_4_ = auVar129._0_4_ * (float)local_3a0._0_4_;
          auVar70._8_4_ = auVar129._8_4_ * fStack_398;
          auVar70._12_4_ = auVar129._12_4_ * fStack_394;
          auVar70._16_4_ = auVar129._16_4_ * fStack_390;
          auVar70._20_4_ = auVar129._20_4_ * fStack_38c;
          auVar70._24_4_ = auVar129._24_4_ * fStack_388;
          auVar70._28_4_ = uStack_384;
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar135,auVar217);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar135,auVar218);
          auVar133 = vfmadd231ps_avx512vl(auVar70,auVar135,local_380);
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar128,auVar196);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar128,local_700);
          auVar118 = vfmadd231ps_fma(auVar133,auVar128,local_360);
          auVar133 = vfmadd231ps_avx512vl(auVar131,auVar127,auVar189);
          auVar122 = vfmadd231ps_avx512vl(auVar130,auVar127,local_6e0);
          auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar127,local_340);
          auVar123 = vmaxps_avx512vl(ZEXT1632(auVar117),ZEXT1632(auVar118));
          auVar131 = vsubps_avx(auVar133,auVar124);
          auVar130 = vsubps_avx(auVar122,auVar132);
          auVar134 = vmulps_avx512vl(auVar132,auVar131);
          auVar149 = vmulps_avx512vl(auVar124,auVar130);
          auVar134 = vsubps_avx512vl(auVar134,auVar149);
          auVar149 = vmulps_avx512vl(auVar130,auVar130);
          auVar149 = vfmadd231ps_avx512vl(auVar149,auVar131,auVar131);
          auVar123 = vmulps_avx512vl(auVar123,auVar123);
          auVar123 = vmulps_avx512vl(auVar123,auVar149);
          auVar134 = vmulps_avx512vl(auVar134,auVar134);
          uVar174 = vcmpps_avx512vl(auVar134,auVar123,2);
          local_5f0 = (byte)uVar36 & (byte)uVar174;
          if (local_5f0 == 0) {
            auVar236 = ZEXT3264(local_6e0);
          }
          else {
            auVar129 = vmulps_avx512vl(local_7e0,auVar129);
            auVar135 = vfmadd213ps_avx512vl(auVar135,local_400,auVar129);
            auVar128 = vfmadd213ps_avx512vl(auVar128,local_3e0,auVar135);
            auVar127 = vfmadd213ps_avx512vl(auVar127,local_3c0,auVar128);
            auVar136 = vmulps_avx512vl(local_7e0,auVar136);
            auVar137 = vfmadd213ps_avx512vl(auVar137,local_400,auVar136);
            auVar125 = vfmadd213ps_avx512vl(auVar125,local_3e0,auVar137);
            auVar128 = vfmadd213ps_avx512vl(auVar126,local_3c0,auVar125);
            auVar126 = *(undefined1 (*) [32])(lVar39 + 0x22284f4 + lVar111 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar39 + 0x2228978 + lVar111 * 4);
            auVar137 = *(undefined1 (*) [32])(lVar39 + 0x2228dfc + lVar111 * 4);
            auVar136 = *(undefined1 (*) [32])(lVar39 + 0x2229280 + lVar111 * 4);
            auVar135 = vmulps_avx512vl(local_720,auVar136);
            auVar129 = vmulps_avx512vl(local_740,auVar136);
            auVar136 = vmulps_avx512vl(local_7e0,auVar136);
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar137,auVar217);
            auVar129 = vfmadd231ps_avx512vl(auVar129,auVar137,auVar218);
            auVar137 = vfmadd231ps_avx512vl(auVar136,local_400,auVar137);
            auVar136 = vfmadd231ps_avx512vl(auVar135,auVar125,auVar196);
            auVar135 = vfmadd231ps_avx512vl(auVar129,auVar125,local_700);
            auVar125 = vfmadd231ps_avx512vl(auVar137,local_3e0,auVar125);
            auVar136 = vfmadd231ps_avx512vl(auVar136,auVar126,auVar189);
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar126,local_6e0);
            auVar129 = vfmadd231ps_avx512vl(auVar125,local_3c0,auVar126);
            auVar126 = *(undefined1 (*) [32])(lVar39 + 0x222a914 + lVar111 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar39 + 0x222b21c + lVar111 * 4);
            auVar137 = *(undefined1 (*) [32])(lVar39 + 0x222b6a0 + lVar111 * 4);
            auVar123 = vmulps_avx512vl(local_720,auVar137);
            auVar134 = vmulps_avx512vl(local_740,auVar137);
            auVar137 = vmulps_avx512vl(local_7e0,auVar137);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,auVar217);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar125,auVar218);
            auVar137 = vfmadd231ps_avx512vl(auVar137,local_400,auVar125);
            auVar125 = *(undefined1 (*) [32])(lVar39 + 0x222ad98 + lVar111 * 4);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,auVar196);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar125,local_700);
            auVar125 = vfmadd231ps_avx512vl(auVar137,local_3e0,auVar125);
            auVar137 = vfmadd231ps_avx512vl(auVar123,auVar126,auVar189);
            auVar123 = vfmadd231ps_avx512vl(auVar134,auVar126,local_6e0);
            auVar125 = vfmadd231ps_avx512vl(auVar125,local_3c0,auVar126);
            auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar136,auVar134);
            vandps_avx512vl(auVar135,auVar134);
            auVar126 = vmaxps_avx(auVar134,auVar134);
            vandps_avx512vl(auVar129,auVar134);
            auVar126 = vmaxps_avx(auVar126,auVar134);
            auVar104._4_4_ = uStack_7fc;
            auVar104._0_4_ = local_800;
            auVar104._8_4_ = uStack_7f8;
            auVar104._12_4_ = uStack_7f4;
            auVar104._16_4_ = uStack_7f0;
            auVar104._20_4_ = uStack_7ec;
            auVar104._24_4_ = uStack_7e8;
            auVar104._28_4_ = uStack_7e4;
            uVar108 = vcmpps_avx512vl(auVar126,auVar104,1);
            bVar22 = (bool)((byte)uVar108 & 1);
            auVar150._0_4_ = (float)((uint)bVar22 * auVar131._0_4_ | (uint)!bVar22 * auVar136._0_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar150._4_4_ = (float)((uint)bVar22 * auVar131._4_4_ | (uint)!bVar22 * auVar136._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar150._8_4_ = (float)((uint)bVar22 * auVar131._8_4_ | (uint)!bVar22 * auVar136._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar150._12_4_ =
                 (float)((uint)bVar22 * auVar131._12_4_ | (uint)!bVar22 * auVar136._12_4_);
            bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar150._16_4_ =
                 (float)((uint)bVar22 * auVar131._16_4_ | (uint)!bVar22 * auVar136._16_4_);
            bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar150._20_4_ =
                 (float)((uint)bVar22 * auVar131._20_4_ | (uint)!bVar22 * auVar136._20_4_);
            bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar150._24_4_ =
                 (float)((uint)bVar22 * auVar131._24_4_ | (uint)!bVar22 * auVar136._24_4_);
            bVar22 = SUB81(uVar108 >> 7,0);
            auVar150._28_4_ = (uint)bVar22 * auVar131._28_4_ | (uint)!bVar22 * auVar136._28_4_;
            bVar22 = (bool)((byte)uVar108 & 1);
            auVar151._0_4_ = (float)((uint)bVar22 * auVar130._0_4_ | (uint)!bVar22 * auVar135._0_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar151._4_4_ = (float)((uint)bVar22 * auVar130._4_4_ | (uint)!bVar22 * auVar135._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar151._8_4_ = (float)((uint)bVar22 * auVar130._8_4_ | (uint)!bVar22 * auVar135._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar151._12_4_ =
                 (float)((uint)bVar22 * auVar130._12_4_ | (uint)!bVar22 * auVar135._12_4_);
            bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar151._16_4_ =
                 (float)((uint)bVar22 * auVar130._16_4_ | (uint)!bVar22 * auVar135._16_4_);
            bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar151._20_4_ =
                 (float)((uint)bVar22 * auVar130._20_4_ | (uint)!bVar22 * auVar135._20_4_);
            bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar151._24_4_ =
                 (float)((uint)bVar22 * auVar130._24_4_ | (uint)!bVar22 * auVar135._24_4_);
            bVar22 = SUB81(uVar108 >> 7,0);
            auVar151._28_4_ = (uint)bVar22 * auVar130._28_4_ | (uint)!bVar22 * auVar135._28_4_;
            vandps_avx512vl(auVar137,auVar134);
            vandps_avx512vl(auVar123,auVar134);
            auVar126 = vmaxps_avx(auVar151,auVar151);
            vandps_avx512vl(auVar125,auVar134);
            auVar126 = vmaxps_avx(auVar126,auVar151);
            uVar108 = vcmpps_avx512vl(auVar126,auVar104,1);
            bVar22 = (bool)((byte)uVar108 & 1);
            auVar152._0_4_ = (uint)bVar22 * auVar131._0_4_ | (uint)!bVar22 * auVar137._0_4_;
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar152._4_4_ = (uint)bVar22 * auVar131._4_4_ | (uint)!bVar22 * auVar137._4_4_;
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar152._8_4_ = (uint)bVar22 * auVar131._8_4_ | (uint)!bVar22 * auVar137._8_4_;
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar152._12_4_ = (uint)bVar22 * auVar131._12_4_ | (uint)!bVar22 * auVar137._12_4_;
            bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar152._16_4_ = (uint)bVar22 * auVar131._16_4_ | (uint)!bVar22 * auVar137._16_4_;
            bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar152._20_4_ = (uint)bVar22 * auVar131._20_4_ | (uint)!bVar22 * auVar137._20_4_;
            bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar152._24_4_ = (uint)bVar22 * auVar131._24_4_ | (uint)!bVar22 * auVar137._24_4_;
            bVar22 = SUB81(uVar108 >> 7,0);
            auVar152._28_4_ = (uint)bVar22 * auVar131._28_4_ | (uint)!bVar22 * auVar137._28_4_;
            bVar22 = (bool)((byte)uVar108 & 1);
            auVar153._0_4_ = (float)((uint)bVar22 * auVar130._0_4_ | (uint)!bVar22 * auVar123._0_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar153._4_4_ = (float)((uint)bVar22 * auVar130._4_4_ | (uint)!bVar22 * auVar123._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar153._8_4_ = (float)((uint)bVar22 * auVar130._8_4_ | (uint)!bVar22 * auVar123._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar153._12_4_ =
                 (float)((uint)bVar22 * auVar130._12_4_ | (uint)!bVar22 * auVar123._12_4_);
            bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar153._16_4_ =
                 (float)((uint)bVar22 * auVar130._16_4_ | (uint)!bVar22 * auVar123._16_4_);
            bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar153._20_4_ =
                 (float)((uint)bVar22 * auVar130._20_4_ | (uint)!bVar22 * auVar123._20_4_);
            bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar153._24_4_ =
                 (float)((uint)bVar22 * auVar130._24_4_ | (uint)!bVar22 * auVar123._24_4_);
            bVar22 = SUB81(uVar108 >> 7,0);
            auVar153._28_4_ = (uint)bVar22 * auVar130._28_4_ | (uint)!bVar22 * auVar123._28_4_;
            auVar228._8_4_ = 0x80000000;
            auVar228._0_8_ = 0x8000000080000000;
            auVar228._12_4_ = 0x80000000;
            auVar228._16_4_ = 0x80000000;
            auVar228._20_4_ = 0x80000000;
            auVar228._24_4_ = 0x80000000;
            auVar228._28_4_ = 0x80000000;
            auVar126 = vxorps_avx512vl(auVar152,auVar228);
            auVar123 = auVar244._0_32_;
            auVar125 = vfmadd213ps_avx512vl(auVar150,auVar150,auVar123);
            auVar243 = vfmadd231ps_fma(auVar125,auVar151,auVar151);
            auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar243));
            auVar240._8_4_ = 0xbf000000;
            auVar240._0_8_ = 0xbf000000bf000000;
            auVar240._12_4_ = 0xbf000000;
            auVar240._16_4_ = 0xbf000000;
            auVar240._20_4_ = 0xbf000000;
            auVar240._24_4_ = 0xbf000000;
            auVar240._28_4_ = 0xbf000000;
            fVar206 = auVar125._0_4_;
            fVar172 = auVar125._4_4_;
            fVar211 = auVar125._8_4_;
            fVar212 = auVar125._12_4_;
            fVar198 = auVar125._16_4_;
            fVar205 = auVar125._20_4_;
            fVar115 = auVar125._24_4_;
            auVar71._4_4_ = fVar172 * fVar172 * fVar172 * auVar243._4_4_ * -0.5;
            auVar71._0_4_ = fVar206 * fVar206 * fVar206 * auVar243._0_4_ * -0.5;
            auVar71._8_4_ = fVar211 * fVar211 * fVar211 * auVar243._8_4_ * -0.5;
            auVar71._12_4_ = fVar212 * fVar212 * fVar212 * auVar243._12_4_ * -0.5;
            auVar71._16_4_ = fVar198 * fVar198 * fVar198 * -0.0;
            auVar71._20_4_ = fVar205 * fVar205 * fVar205 * -0.0;
            auVar71._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar71._28_4_ = auVar151._28_4_;
            auVar137 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar125 = vfmadd231ps_avx512vl(auVar71,auVar137,auVar125);
            auVar72._4_4_ = auVar151._4_4_ * auVar125._4_4_;
            auVar72._0_4_ = auVar151._0_4_ * auVar125._0_4_;
            auVar72._8_4_ = auVar151._8_4_ * auVar125._8_4_;
            auVar72._12_4_ = auVar151._12_4_ * auVar125._12_4_;
            auVar72._16_4_ = auVar151._16_4_ * auVar125._16_4_;
            auVar72._20_4_ = auVar151._20_4_ * auVar125._20_4_;
            auVar72._24_4_ = auVar151._24_4_ * auVar125._24_4_;
            auVar72._28_4_ = 0;
            auVar73._4_4_ = auVar125._4_4_ * -auVar150._4_4_;
            auVar73._0_4_ = auVar125._0_4_ * -auVar150._0_4_;
            auVar73._8_4_ = auVar125._8_4_ * -auVar150._8_4_;
            auVar73._12_4_ = auVar125._12_4_ * -auVar150._12_4_;
            auVar73._16_4_ = auVar125._16_4_ * -auVar150._16_4_;
            auVar73._20_4_ = auVar125._20_4_ * -auVar150._20_4_;
            auVar73._24_4_ = auVar125._24_4_ * -auVar150._24_4_;
            auVar73._28_4_ = auVar151._28_4_;
            auVar136 = vmulps_avx512vl(auVar125,auVar123);
            auVar125 = vfmadd213ps_avx512vl(auVar152,auVar152,auVar123);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar153,auVar153);
            auVar135 = vrsqrt14ps_avx512vl(auVar125);
            auVar125 = vmulps_avx512vl(auVar125,auVar240);
            fVar206 = auVar135._0_4_;
            fVar172 = auVar135._4_4_;
            fVar211 = auVar135._8_4_;
            fVar212 = auVar135._12_4_;
            fVar198 = auVar135._16_4_;
            fVar205 = auVar135._20_4_;
            fVar115 = auVar135._24_4_;
            auVar74._4_4_ = fVar172 * fVar172 * fVar172 * auVar125._4_4_;
            auVar74._0_4_ = fVar206 * fVar206 * fVar206 * auVar125._0_4_;
            auVar74._8_4_ = fVar211 * fVar211 * fVar211 * auVar125._8_4_;
            auVar74._12_4_ = fVar212 * fVar212 * fVar212 * auVar125._12_4_;
            auVar74._16_4_ = fVar198 * fVar198 * fVar198 * auVar125._16_4_;
            auVar74._20_4_ = fVar205 * fVar205 * fVar205 * auVar125._20_4_;
            auVar74._24_4_ = fVar115 * fVar115 * fVar115 * auVar125._24_4_;
            auVar74._28_4_ = auVar125._28_4_;
            auVar125 = vfmadd231ps_avx512vl(auVar74,auVar137,auVar135);
            auVar75._4_4_ = auVar153._4_4_ * auVar125._4_4_;
            auVar75._0_4_ = auVar153._0_4_ * auVar125._0_4_;
            auVar75._8_4_ = auVar153._8_4_ * auVar125._8_4_;
            auVar75._12_4_ = auVar153._12_4_ * auVar125._12_4_;
            auVar75._16_4_ = auVar153._16_4_ * auVar125._16_4_;
            auVar75._20_4_ = auVar153._20_4_ * auVar125._20_4_;
            auVar75._24_4_ = auVar153._24_4_ * auVar125._24_4_;
            auVar75._28_4_ = auVar135._28_4_;
            auVar76._4_4_ = auVar125._4_4_ * auVar126._4_4_;
            auVar76._0_4_ = auVar125._0_4_ * auVar126._0_4_;
            auVar76._8_4_ = auVar125._8_4_ * auVar126._8_4_;
            auVar76._12_4_ = auVar125._12_4_ * auVar126._12_4_;
            auVar76._16_4_ = auVar125._16_4_ * auVar126._16_4_;
            auVar76._20_4_ = auVar125._20_4_ * auVar126._20_4_;
            auVar76._24_4_ = auVar125._24_4_ * auVar126._24_4_;
            auVar76._28_4_ = auVar126._28_4_;
            auVar126 = vmulps_avx512vl(auVar125,auVar123);
            auVar243 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar117),auVar124);
            auVar125 = ZEXT1632(auVar117);
            auVar8 = vfmadd213ps_fma(auVar73,auVar125,auVar132);
            auVar137 = vfmadd213ps_avx512vl(auVar136,auVar125,auVar128);
            auVar135 = vfmadd213ps_avx512vl(auVar75,ZEXT1632(auVar118),auVar133);
            auVar175 = vfnmadd213ps_fma(auVar72,auVar125,auVar124);
            auVar129 = ZEXT1632(auVar118);
            auVar9 = vfmadd213ps_fma(auVar76,auVar129,auVar122);
            auVar119 = vfnmadd213ps_fma(auVar73,auVar125,auVar132);
            auVar10 = vfmadd213ps_fma(auVar126,auVar129,auVar127);
            auVar132 = ZEXT1632(auVar117);
            auVar121 = vfnmadd231ps_fma(auVar128,auVar132,auVar136);
            auVar120 = vfnmadd213ps_fma(auVar75,auVar129,auVar133);
            auVar188 = vfnmadd213ps_fma(auVar76,auVar129,auVar122);
            auVar190 = vfnmadd231ps_fma(auVar127,ZEXT1632(auVar118),auVar126);
            auVar127 = vsubps_avx512vl(auVar135,ZEXT1632(auVar175));
            auVar126 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar119));
            auVar125 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar121));
            auVar77._4_4_ = auVar126._4_4_ * auVar121._4_4_;
            auVar77._0_4_ = auVar126._0_4_ * auVar121._0_4_;
            auVar77._8_4_ = auVar126._8_4_ * auVar121._8_4_;
            auVar77._12_4_ = auVar126._12_4_ * auVar121._12_4_;
            auVar77._16_4_ = auVar126._16_4_ * 0.0;
            auVar77._20_4_ = auVar126._20_4_ * 0.0;
            auVar77._24_4_ = auVar126._24_4_ * 0.0;
            auVar77._28_4_ = auVar136._28_4_;
            auVar117 = vfmsub231ps_fma(auVar77,ZEXT1632(auVar119),auVar125);
            auVar78._4_4_ = auVar125._4_4_ * auVar175._4_4_;
            auVar78._0_4_ = auVar125._0_4_ * auVar175._0_4_;
            auVar78._8_4_ = auVar125._8_4_ * auVar175._8_4_;
            auVar78._12_4_ = auVar125._12_4_ * auVar175._12_4_;
            auVar78._16_4_ = auVar125._16_4_ * 0.0;
            auVar78._20_4_ = auVar125._20_4_ * 0.0;
            auVar78._24_4_ = auVar125._24_4_ * 0.0;
            auVar78._28_4_ = auVar125._28_4_;
            auVar11 = vfmsub231ps_fma(auVar78,ZEXT1632(auVar121),auVar127);
            auVar79._4_4_ = auVar119._4_4_ * auVar127._4_4_;
            auVar79._0_4_ = auVar119._0_4_ * auVar127._0_4_;
            auVar79._8_4_ = auVar119._8_4_ * auVar127._8_4_;
            auVar79._12_4_ = auVar119._12_4_ * auVar127._12_4_;
            auVar79._16_4_ = auVar127._16_4_ * 0.0;
            auVar79._20_4_ = auVar127._20_4_ * 0.0;
            auVar79._24_4_ = auVar127._24_4_ * 0.0;
            auVar79._28_4_ = auVar127._28_4_;
            auVar12 = vfmsub231ps_fma(auVar79,ZEXT1632(auVar175),auVar126);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar123,ZEXT1632(auVar11));
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar123,ZEXT1632(auVar117));
            uVar108 = vcmpps_avx512vl(auVar126,auVar123,2);
            bVar114 = (byte)uVar108;
            fVar197 = (float)((uint)(bVar114 & 1) * auVar243._0_4_ |
                             (uint)!(bool)(bVar114 & 1) * auVar120._0_4_);
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            fVar166 = (float)((uint)bVar22 * auVar243._4_4_ | (uint)!bVar22 * auVar120._4_4_);
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            fVar169 = (float)((uint)bVar22 * auVar243._8_4_ | (uint)!bVar22 * auVar120._8_4_);
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            fVar170 = (float)((uint)bVar22 * auVar243._12_4_ | (uint)!bVar22 * auVar120._12_4_);
            auVar129 = ZEXT1632(CONCAT412(fVar170,CONCAT48(fVar169,CONCAT44(fVar166,fVar197))));
            fVar165 = (float)((uint)(bVar114 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar114 & 1) * auVar188._0_4_);
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            fVar168 = (float)((uint)bVar22 * auVar8._4_4_ | (uint)!bVar22 * auVar188._4_4_);
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            fVar167 = (float)((uint)bVar22 * auVar8._8_4_ | (uint)!bVar22 * auVar188._8_4_);
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            fVar171 = (float)((uint)bVar22 * auVar8._12_4_ | (uint)!bVar22 * auVar188._12_4_);
            auVar131 = ZEXT1632(CONCAT412(fVar171,CONCAT48(fVar167,CONCAT44(fVar168,fVar165))));
            auVar154._0_4_ =
                 (float)((uint)(bVar114 & 1) * auVar137._0_4_ |
                        (uint)!(bool)(bVar114 & 1) * auVar190._0_4_);
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar154._4_4_ = (float)((uint)bVar22 * auVar137._4_4_ | (uint)!bVar22 * auVar190._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar154._8_4_ = (float)((uint)bVar22 * auVar137._8_4_ | (uint)!bVar22 * auVar190._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar154._12_4_ =
                 (float)((uint)bVar22 * auVar137._12_4_ | (uint)!bVar22 * auVar190._12_4_);
            fVar211 = (float)((uint)((byte)(uVar108 >> 4) & 1) * auVar137._16_4_);
            auVar154._16_4_ = fVar211;
            fVar172 = (float)((uint)((byte)(uVar108 >> 5) & 1) * auVar137._20_4_);
            auVar154._20_4_ = fVar172;
            fVar206 = (float)((uint)((byte)(uVar108 >> 6) & 1) * auVar137._24_4_);
            auVar154._24_4_ = fVar206;
            iVar1 = (uint)(byte)(uVar108 >> 7) * auVar137._28_4_;
            auVar154._28_4_ = iVar1;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar175),auVar135);
            auVar155._0_4_ =
                 (uint)(bVar114 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar114 & 1) * auVar117._0_4_;
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar155._4_4_ = (uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * auVar117._4_4_;
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar155._8_4_ = (uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * auVar117._8_4_;
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar155._12_4_ = (uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * auVar117._12_4_;
            auVar155._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * auVar126._16_4_;
            auVar155._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * auVar126._20_4_;
            auVar155._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * auVar126._24_4_;
            auVar155._28_4_ = (uint)(byte)(uVar108 >> 7) * auVar126._28_4_;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar119),ZEXT1632(auVar9));
            auVar156._0_4_ =
                 (float)((uint)(bVar114 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar114 & 1) * auVar243._0_4_);
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar156._4_4_ = (float)((uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * auVar243._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar156._8_4_ = (float)((uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * auVar243._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar156._12_4_ =
                 (float)((uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * auVar243._12_4_);
            fVar205 = (float)((uint)((byte)(uVar108 >> 4) & 1) * auVar126._16_4_);
            auVar156._16_4_ = fVar205;
            fVar198 = (float)((uint)((byte)(uVar108 >> 5) & 1) * auVar126._20_4_);
            auVar156._20_4_ = fVar198;
            fVar212 = (float)((uint)((byte)(uVar108 >> 6) & 1) * auVar126._24_4_);
            auVar156._24_4_ = fVar212;
            auVar156._28_4_ = (uint)(byte)(uVar108 >> 7) * auVar126._28_4_;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar121),ZEXT1632(auVar10));
            auVar157._0_4_ =
                 (float)((uint)(bVar114 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar114 & 1) * auVar8._0_4_);
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar157._4_4_ = (float)((uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * auVar8._4_4_);
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar157._8_4_ = (float)((uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * auVar8._8_4_);
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar157._12_4_ =
                 (float)((uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * auVar8._12_4_);
            fVar116 = (float)((uint)((byte)(uVar108 >> 4) & 1) * auVar126._16_4_);
            auVar157._16_4_ = fVar116;
            fVar164 = (float)((uint)((byte)(uVar108 >> 5) & 1) * auVar126._20_4_);
            auVar157._20_4_ = fVar164;
            fVar115 = (float)((uint)((byte)(uVar108 >> 6) & 1) * auVar126._24_4_);
            auVar157._24_4_ = fVar115;
            iVar2 = (uint)(byte)(uVar108 >> 7) * auVar126._28_4_;
            auVar157._28_4_ = iVar2;
            auVar158._0_4_ =
                 (uint)(bVar114 & 1) * (int)auVar175._0_4_ |
                 (uint)!(bool)(bVar114 & 1) * auVar135._0_4_;
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar158._4_4_ = (uint)bVar22 * (int)auVar175._4_4_ | (uint)!bVar22 * auVar135._4_4_;
            bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar158._8_4_ = (uint)bVar22 * (int)auVar175._8_4_ | (uint)!bVar22 * auVar135._8_4_;
            bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar158._12_4_ = (uint)bVar22 * (int)auVar175._12_4_ | (uint)!bVar22 * auVar135._12_4_;
            auVar158._16_4_ = (uint)!(bool)((byte)(uVar108 >> 4) & 1) * auVar135._16_4_;
            auVar158._20_4_ = (uint)!(bool)((byte)(uVar108 >> 5) & 1) * auVar135._20_4_;
            auVar158._24_4_ = (uint)!(bool)((byte)(uVar108 >> 6) & 1) * auVar135._24_4_;
            auVar158._28_4_ = (uint)!SUB81(uVar108 >> 7,0) * auVar135._28_4_;
            bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
            bVar24 = (bool)((byte)(uVar108 >> 2) & 1);
            bVar26 = (bool)((byte)(uVar108 >> 3) & 1);
            bVar23 = (bool)((byte)(uVar108 >> 1) & 1);
            bVar25 = (bool)((byte)(uVar108 >> 2) & 1);
            bVar27 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar135 = vsubps_avx512vl(auVar158,auVar129);
            auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar26 * (int)auVar119._12_4_ |
                                                     (uint)!bVar26 * auVar9._12_4_,
                                                     CONCAT48((uint)bVar24 * (int)auVar119._8_4_ |
                                                              (uint)!bVar24 * auVar9._8_4_,
                                                              CONCAT44((uint)bVar22 *
                                                                       (int)auVar119._4_4_ |
                                                                       (uint)!bVar22 * auVar9._4_4_,
                                                                       (uint)(bVar114 & 1) *
                                                                       (int)auVar119._0_4_ |
                                                                       (uint)!(bool)(bVar114 & 1) *
                                                                       auVar9._0_4_)))),auVar131);
            auVar137 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar27 * (int)auVar121._12_4_ |
                                                     (uint)!bVar27 * auVar10._12_4_,
                                                     CONCAT48((uint)bVar25 * (int)auVar121._8_4_ |
                                                              (uint)!bVar25 * auVar10._8_4_,
                                                              CONCAT44((uint)bVar23 *
                                                                       (int)auVar121._4_4_ |
                                                                       (uint)!bVar23 * auVar10._4_4_
                                                                       ,(uint)(bVar114 & 1) *
                                                                        (int)auVar121._0_4_ |
                                                                        (uint)!(bool)(bVar114 & 1) *
                                                                        auVar10._0_4_)))),auVar154);
            auVar136 = vsubps_avx(auVar129,auVar155);
            auVar127 = vsubps_avx(auVar131,auVar156);
            auVar128 = vsubps_avx(auVar154,auVar157);
            auVar80._4_4_ = auVar137._4_4_ * fVar166;
            auVar80._0_4_ = auVar137._0_4_ * fVar197;
            auVar80._8_4_ = auVar137._8_4_ * fVar169;
            auVar80._12_4_ = auVar137._12_4_ * fVar170;
            auVar80._16_4_ = auVar137._16_4_ * 0.0;
            auVar80._20_4_ = auVar137._20_4_ * 0.0;
            auVar80._24_4_ = auVar137._24_4_ * 0.0;
            auVar80._28_4_ = 0;
            auVar117 = vfmsub231ps_fma(auVar80,auVar154,auVar135);
            auVar204._0_4_ = fVar165 * auVar135._0_4_;
            auVar204._4_4_ = fVar168 * auVar135._4_4_;
            auVar204._8_4_ = fVar167 * auVar135._8_4_;
            auVar204._12_4_ = fVar171 * auVar135._12_4_;
            auVar204._16_4_ = auVar135._16_4_ * 0.0;
            auVar204._20_4_ = auVar135._20_4_ * 0.0;
            auVar204._24_4_ = auVar135._24_4_ * 0.0;
            auVar204._28_4_ = 0;
            auVar243 = vfmsub231ps_fma(auVar204,auVar129,auVar125);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar243),auVar123,ZEXT1632(auVar117));
            auVar209._0_4_ = auVar125._0_4_ * auVar154._0_4_;
            auVar209._4_4_ = auVar125._4_4_ * auVar154._4_4_;
            auVar209._8_4_ = auVar125._8_4_ * auVar154._8_4_;
            auVar209._12_4_ = auVar125._12_4_ * auVar154._12_4_;
            auVar209._16_4_ = auVar125._16_4_ * fVar211;
            auVar209._20_4_ = auVar125._20_4_ * fVar172;
            auVar209._24_4_ = auVar125._24_4_ * fVar206;
            auVar209._28_4_ = 0;
            auVar117 = vfmsub231ps_fma(auVar209,auVar131,auVar137);
            auVar130 = vfmadd231ps_avx512vl(auVar126,auVar123,ZEXT1632(auVar117));
            auVar126 = vmulps_avx512vl(auVar128,auVar155);
            auVar126 = vfmsub231ps_avx512vl(auVar126,auVar136,auVar157);
            auVar81._4_4_ = auVar127._4_4_ * auVar157._4_4_;
            auVar81._0_4_ = auVar127._0_4_ * auVar157._0_4_;
            auVar81._8_4_ = auVar127._8_4_ * auVar157._8_4_;
            auVar81._12_4_ = auVar127._12_4_ * auVar157._12_4_;
            auVar81._16_4_ = auVar127._16_4_ * fVar116;
            auVar81._20_4_ = auVar127._20_4_ * fVar164;
            auVar81._24_4_ = auVar127._24_4_ * fVar115;
            auVar81._28_4_ = iVar2;
            auVar117 = vfmsub231ps_fma(auVar81,auVar156,auVar128);
            auVar210._0_4_ = auVar156._0_4_ * auVar136._0_4_;
            auVar210._4_4_ = auVar156._4_4_ * auVar136._4_4_;
            auVar210._8_4_ = auVar156._8_4_ * auVar136._8_4_;
            auVar210._12_4_ = auVar156._12_4_ * auVar136._12_4_;
            auVar210._16_4_ = fVar205 * auVar136._16_4_;
            auVar210._20_4_ = fVar198 * auVar136._20_4_;
            auVar210._24_4_ = fVar212 * auVar136._24_4_;
            auVar210._28_4_ = 0;
            auVar243 = vfmsub231ps_fma(auVar210,auVar127,auVar155);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar243),auVar123,auVar126);
            auVar124 = vfmadd231ps_avx512vl(auVar126,auVar123,ZEXT1632(auVar117));
            auVar126 = vmaxps_avx(auVar130,auVar124);
            uVar174 = vcmpps_avx512vl(auVar126,auVar123,2);
            local_5f0 = local_5f0 & (byte)uVar174;
            if (local_5f0 == 0) {
LAB_01eee841:
              local_5f0 = 0;
            }
            else {
              auVar82._4_4_ = auVar128._4_4_ * auVar125._4_4_;
              auVar82._0_4_ = auVar128._0_4_ * auVar125._0_4_;
              auVar82._8_4_ = auVar128._8_4_ * auVar125._8_4_;
              auVar82._12_4_ = auVar128._12_4_ * auVar125._12_4_;
              auVar82._16_4_ = auVar128._16_4_ * auVar125._16_4_;
              auVar82._20_4_ = auVar128._20_4_ * auVar125._20_4_;
              auVar82._24_4_ = auVar128._24_4_ * auVar125._24_4_;
              auVar82._28_4_ = auVar126._28_4_;
              auVar8 = vfmsub231ps_fma(auVar82,auVar127,auVar137);
              auVar83._4_4_ = auVar137._4_4_ * auVar136._4_4_;
              auVar83._0_4_ = auVar137._0_4_ * auVar136._0_4_;
              auVar83._8_4_ = auVar137._8_4_ * auVar136._8_4_;
              auVar83._12_4_ = auVar137._12_4_ * auVar136._12_4_;
              auVar83._16_4_ = auVar137._16_4_ * auVar136._16_4_;
              auVar83._20_4_ = auVar137._20_4_ * auVar136._20_4_;
              auVar83._24_4_ = auVar137._24_4_ * auVar136._24_4_;
              auVar83._28_4_ = auVar137._28_4_;
              auVar243 = vfmsub231ps_fma(auVar83,auVar135,auVar128);
              auVar84._4_4_ = auVar127._4_4_ * auVar135._4_4_;
              auVar84._0_4_ = auVar127._0_4_ * auVar135._0_4_;
              auVar84._8_4_ = auVar127._8_4_ * auVar135._8_4_;
              auVar84._12_4_ = auVar127._12_4_ * auVar135._12_4_;
              auVar84._16_4_ = auVar127._16_4_ * auVar135._16_4_;
              auVar84._20_4_ = auVar127._20_4_ * auVar135._20_4_;
              auVar84._24_4_ = auVar127._24_4_ * auVar135._24_4_;
              auVar84._28_4_ = auVar127._28_4_;
              auVar9 = vfmsub231ps_fma(auVar84,auVar136,auVar125);
              auVar117 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar243),ZEXT1632(auVar9));
              auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),ZEXT1632(auVar8),auVar123);
              auVar125 = vrcp14ps_avx512vl(auVar126);
              auVar45._8_4_ = 0x3f800000;
              auVar45._0_8_ = &DAT_3f8000003f800000;
              auVar45._12_4_ = 0x3f800000;
              auVar45._16_4_ = 0x3f800000;
              auVar45._20_4_ = 0x3f800000;
              auVar45._24_4_ = 0x3f800000;
              auVar45._28_4_ = 0x3f800000;
              auVar137 = vfnmadd213ps_avx512vl(auVar125,auVar126,auVar45);
              auVar117 = vfmadd132ps_fma(auVar137,auVar125,auVar125);
              auVar85._4_4_ = auVar9._4_4_ * auVar154._4_4_;
              auVar85._0_4_ = auVar9._0_4_ * auVar154._0_4_;
              auVar85._8_4_ = auVar9._8_4_ * auVar154._8_4_;
              auVar85._12_4_ = auVar9._12_4_ * auVar154._12_4_;
              auVar85._16_4_ = fVar211 * 0.0;
              auVar85._20_4_ = fVar172 * 0.0;
              auVar85._24_4_ = fVar206 * 0.0;
              auVar85._28_4_ = iVar1;
              auVar243 = vfmadd231ps_fma(auVar85,auVar131,ZEXT1632(auVar243));
              auVar243 = vfmadd231ps_fma(ZEXT1632(auVar243),auVar129,ZEXT1632(auVar8));
              fVar206 = auVar117._0_4_;
              fVar172 = auVar117._4_4_;
              fVar211 = auVar117._8_4_;
              fVar212 = auVar117._12_4_;
              auVar125 = ZEXT1632(CONCAT412(auVar243._12_4_ * fVar212,
                                            CONCAT48(auVar243._8_4_ * fVar211,
                                                     CONCAT44(auVar243._4_4_ * fVar172,
                                                              auVar243._0_4_ * fVar206))));
              auVar105._4_4_ = uStack_6bc;
              auVar105._0_4_ = local_6c0;
              auVar105._8_4_ = uStack_6b8;
              auVar105._12_4_ = uStack_6b4;
              auVar105._16_4_ = uStack_6b0;
              auVar105._20_4_ = uStack_6ac;
              auVar105._24_4_ = uStack_6a8;
              auVar105._28_4_ = uStack_6a4;
              uVar174 = vcmpps_avx512vl(auVar125,auVar105,0xd);
              uVar173 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar46._4_4_ = uVar173;
              auVar46._0_4_ = uVar173;
              auVar46._8_4_ = uVar173;
              auVar46._12_4_ = uVar173;
              auVar46._16_4_ = uVar173;
              auVar46._20_4_ = uVar173;
              auVar46._24_4_ = uVar173;
              auVar46._28_4_ = uVar173;
              uVar36 = vcmpps_avx512vl(auVar125,auVar46,2);
              local_5f0 = (byte)uVar174 & (byte)uVar36 & local_5f0;
              if (local_5f0 == 0) goto LAB_01eee841;
              uVar174 = vcmpps_avx512vl(auVar126,auVar123,4);
              if ((local_5f0 & (byte)uVar174) == 0) {
                local_5f0 = 0;
              }
              else {
                local_5f0 = local_5f0 & (byte)uVar174;
                fVar198 = auVar130._0_4_ * fVar206;
                fVar205 = auVar130._4_4_ * fVar172;
                auVar86._4_4_ = fVar205;
                auVar86._0_4_ = fVar198;
                fVar115 = auVar130._8_4_ * fVar211;
                auVar86._8_4_ = fVar115;
                fVar116 = auVar130._12_4_ * fVar212;
                auVar86._12_4_ = fVar116;
                fVar164 = auVar130._16_4_ * 0.0;
                auVar86._16_4_ = fVar164;
                fVar197 = auVar130._20_4_ * 0.0;
                auVar86._20_4_ = fVar197;
                fVar165 = auVar130._24_4_ * 0.0;
                auVar86._24_4_ = fVar165;
                auVar86._28_4_ = auVar130._28_4_;
                fVar206 = auVar124._0_4_ * fVar206;
                fVar172 = auVar124._4_4_ * fVar172;
                auVar87._4_4_ = fVar172;
                auVar87._0_4_ = fVar206;
                fVar211 = auVar124._8_4_ * fVar211;
                auVar87._8_4_ = fVar211;
                fVar212 = auVar124._12_4_ * fVar212;
                auVar87._12_4_ = fVar212;
                fVar166 = auVar124._16_4_ * 0.0;
                auVar87._16_4_ = fVar166;
                fVar168 = auVar124._20_4_ * 0.0;
                auVar87._20_4_ = fVar168;
                fVar169 = auVar124._24_4_ * 0.0;
                auVar87._24_4_ = fVar169;
                auVar87._28_4_ = auVar124._28_4_;
                auVar220._8_4_ = 0x3f800000;
                auVar220._0_8_ = &DAT_3f8000003f800000;
                auVar220._12_4_ = 0x3f800000;
                auVar220._16_4_ = 0x3f800000;
                auVar220._20_4_ = 0x3f800000;
                auVar220._24_4_ = 0x3f800000;
                auVar220._28_4_ = 0x3f800000;
                auVar126 = vsubps_avx(auVar220,auVar86);
                local_8a0._0_4_ =
                     (uint)(bVar114 & 1) * (int)fVar198 |
                     (uint)!(bool)(bVar114 & 1) * auVar126._0_4_;
                bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
                local_8a0._4_4_ = (uint)bVar22 * (int)fVar205 | (uint)!bVar22 * auVar126._4_4_;
                bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
                local_8a0._8_4_ = (uint)bVar22 * (int)fVar115 | (uint)!bVar22 * auVar126._8_4_;
                bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
                local_8a0._12_4_ = (uint)bVar22 * (int)fVar116 | (uint)!bVar22 * auVar126._12_4_;
                bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
                local_8a0._16_4_ = (uint)bVar22 * (int)fVar164 | (uint)!bVar22 * auVar126._16_4_;
                bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
                local_8a0._20_4_ = (uint)bVar22 * (int)fVar197 | (uint)!bVar22 * auVar126._20_4_;
                bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
                local_8a0._24_4_ = (uint)bVar22 * (int)fVar165 | (uint)!bVar22 * auVar126._24_4_;
                bVar22 = SUB81(uVar108 >> 7,0);
                local_8a0._28_4_ = (uint)bVar22 * auVar130._28_4_ | (uint)!bVar22 * auVar126._28_4_;
                auVar126 = vsubps_avx(auVar220,auVar87);
                local_500._0_4_ =
                     (uint)(bVar114 & 1) * (int)fVar206 |
                     (uint)!(bool)(bVar114 & 1) * auVar126._0_4_;
                bVar22 = (bool)((byte)(uVar108 >> 1) & 1);
                local_500._4_4_ = (uint)bVar22 * (int)fVar172 | (uint)!bVar22 * auVar126._4_4_;
                bVar22 = (bool)((byte)(uVar108 >> 2) & 1);
                local_500._8_4_ = (uint)bVar22 * (int)fVar211 | (uint)!bVar22 * auVar126._8_4_;
                bVar22 = (bool)((byte)(uVar108 >> 3) & 1);
                local_500._12_4_ = (uint)bVar22 * (int)fVar212 | (uint)!bVar22 * auVar126._12_4_;
                bVar22 = (bool)((byte)(uVar108 >> 4) & 1);
                local_500._16_4_ = (uint)bVar22 * (int)fVar166 | (uint)!bVar22 * auVar126._16_4_;
                bVar22 = (bool)((byte)(uVar108 >> 5) & 1);
                local_500._20_4_ = (uint)bVar22 * (int)fVar168 | (uint)!bVar22 * auVar126._20_4_;
                bVar22 = (bool)((byte)(uVar108 >> 6) & 1);
                local_500._24_4_ = (uint)bVar22 * (int)fVar169 | (uint)!bVar22 * auVar126._24_4_;
                bVar22 = SUB81(uVar108 >> 7,0);
                local_500._28_4_ = (uint)bVar22 * auVar124._28_4_ | (uint)!bVar22 * auVar126._28_4_;
                local_8c0 = auVar125;
              }
            }
            auVar236 = ZEXT3264(local_6e0);
            if (local_5f0 != 0) {
              auVar126 = vsubps_avx(ZEXT1632(auVar118),auVar132);
              auVar117 = vfmadd213ps_fma(auVar126,local_8a0,auVar132);
              uVar173 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar47._4_4_ = uVar173;
              auVar47._0_4_ = uVar173;
              auVar47._8_4_ = uVar173;
              auVar47._12_4_ = uVar173;
              auVar47._16_4_ = uVar173;
              auVar47._20_4_ = uVar173;
              auVar47._24_4_ = uVar173;
              auVar47._28_4_ = uVar173;
              auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar117._12_4_ + auVar117._12_4_,
                                                            CONCAT48(auVar117._8_4_ + auVar117._8_4_
                                                                     ,CONCAT44(auVar117._4_4_ +
                                                                               auVar117._4_4_,
                                                                               auVar117._0_4_ +
                                                                               auVar117._0_4_)))),
                                         auVar47);
              uVar174 = vcmpps_avx512vl(local_8c0,auVar126,6);
              local_5f0 = local_5f0 & (byte)uVar174;
              if (local_5f0 != 0) {
                auVar183._8_4_ = 0xbf800000;
                auVar183._0_8_ = 0xbf800000bf800000;
                auVar183._12_4_ = 0xbf800000;
                auVar183._16_4_ = 0xbf800000;
                auVar183._20_4_ = 0xbf800000;
                auVar183._24_4_ = 0xbf800000;
                auVar183._28_4_ = 0xbf800000;
                auVar48._8_4_ = 0x40000000;
                auVar48._0_8_ = 0x4000000040000000;
                auVar48._12_4_ = 0x40000000;
                auVar48._16_4_ = 0x40000000;
                auVar48._20_4_ = 0x40000000;
                auVar48._24_4_ = 0x40000000;
                auVar48._28_4_ = 0x40000000;
                local_680 = vfmadd132ps_avx512vl(local_500,auVar183,auVar48);
                local_500 = local_680;
                auVar126 = local_500;
                local_640 = (undefined4)lVar111;
                local_630 = local_960;
                uStack_628 = uStack_958;
                local_620 = local_8e0._0_8_;
                uStack_618 = local_8e0._8_8_;
                local_610 = local_8f0._0_8_;
                uStack_608 = local_8f0._8_8_;
                local_600 = local_8d0;
                uStack_5f8 = uStack_8c8;
                pGVar17 = (context->scene->geometries).items[uVar112].ptr;
                local_500 = auVar126;
                if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar117 = vcvtsi2ss_avx512f(auVar241._0_16_,local_640);
                  fVar206 = auVar117._0_4_;
                  local_5e0[0] = (fVar206 + local_8a0._0_4_ + 0.0) * local_520;
                  local_5e0[1] = (fVar206 + local_8a0._4_4_ + 1.0) * fStack_51c;
                  local_5e0[2] = (fVar206 + local_8a0._8_4_ + 2.0) * fStack_518;
                  local_5e0[3] = (fVar206 + local_8a0._12_4_ + 3.0) * fStack_514;
                  fStack_5d0 = (fVar206 + local_8a0._16_4_ + 4.0) * fStack_510;
                  fStack_5cc = (fVar206 + local_8a0._20_4_ + 5.0) * fStack_50c;
                  fStack_5c8 = (fVar206 + local_8a0._24_4_ + 6.0) * fStack_508;
                  fStack_5c4 = fVar206 + local_8a0._28_4_ + 7.0;
                  local_500._0_8_ = local_680._0_8_;
                  local_500._8_8_ = local_680._8_8_;
                  local_500._16_8_ = local_680._16_8_;
                  local_500._24_8_ = local_680._24_8_;
                  local_5c0 = local_500._0_8_;
                  uStack_5b8 = local_500._8_8_;
                  uStack_5b0 = local_500._16_8_;
                  uStack_5a8 = local_500._24_8_;
                  local_5a0 = local_8c0;
                  auVar184._8_4_ = 0x7f800000;
                  auVar184._0_8_ = 0x7f8000007f800000;
                  auVar184._12_4_ = 0x7f800000;
                  auVar184._16_4_ = 0x7f800000;
                  auVar184._20_4_ = 0x7f800000;
                  auVar184._24_4_ = 0x7f800000;
                  auVar184._28_4_ = 0x7f800000;
                  auVar126 = vblendmps_avx512vl(auVar184,local_8c0);
                  auVar159._0_4_ =
                       (uint)(local_5f0 & 1) * auVar126._0_4_ |
                       (uint)!(bool)(local_5f0 & 1) * 0x7f800000;
                  bVar22 = (bool)(local_5f0 >> 1 & 1);
                  auVar159._4_4_ = (uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_5f0 >> 2 & 1);
                  auVar159._8_4_ = (uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_5f0 >> 3 & 1);
                  auVar159._12_4_ = (uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_5f0 >> 4 & 1);
                  auVar159._16_4_ = (uint)bVar22 * auVar126._16_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_5f0 >> 5 & 1);
                  auVar159._20_4_ = (uint)bVar22 * auVar126._20_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_5f0 >> 6 & 1);
                  auVar159._24_4_ = (uint)bVar22 * auVar126._24_4_ | (uint)!bVar22 * 0x7f800000;
                  auVar159._28_4_ =
                       (uint)(local_5f0 >> 7) * auVar126._28_4_ |
                       (uint)!(bool)(local_5f0 >> 7) * 0x7f800000;
                  auVar126 = vshufps_avx(auVar159,auVar159,0xb1);
                  auVar126 = vminps_avx(auVar159,auVar126);
                  auVar125 = vshufpd_avx(auVar126,auVar126,5);
                  auVar126 = vminps_avx(auVar126,auVar125);
                  auVar125 = vpermpd_avx2(auVar126,0x4e);
                  auVar126 = vminps_avx(auVar126,auVar125);
                  uVar174 = vcmpps_avx512vl(auVar159,auVar126,0);
                  bVar107 = (byte)uVar174 & local_5f0;
                  bVar114 = local_5f0;
                  if (bVar107 != 0) {
                    bVar114 = bVar107;
                  }
                  uVar38 = 0;
                  for (uVar109 = (uint)bVar114; (uVar109 & 1) == 0;
                      uVar109 = uVar109 >> 1 | 0x80000000) {
                    uVar38 = uVar38 + 1;
                  }
                  uVar108 = (ulong)uVar38;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar206 = local_5e0[uVar108];
                    uVar173 = *(undefined4 *)((long)&local_5c0 + uVar108 * 4);
                    fVar211 = 1.0 - fVar206;
                    fVar172 = fVar211 * fVar211 * -3.0;
                    auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211)),
                                               ZEXT416((uint)(fVar206 * fVar211)),
                                               ZEXT416(0xc0000000));
                    auVar118 = vfmsub132ss_fma(ZEXT416((uint)(fVar206 * fVar211)),
                                               ZEXT416((uint)(fVar206 * fVar206)),
                                               ZEXT416(0x40000000));
                    fVar211 = auVar117._0_4_ * 3.0;
                    fVar212 = auVar118._0_4_ * 3.0;
                    fVar198 = fVar206 * fVar206 * 3.0;
                    auVar214._0_4_ = fVar198 * (float)local_8d0._0_4_;
                    auVar214._4_4_ = fVar198 * (float)local_8d0._4_4_;
                    auVar214._8_4_ = fVar198 * (float)uStack_8c8;
                    auVar214._12_4_ = fVar198 * uStack_8c8._4_4_;
                    auVar194._4_4_ = fVar212;
                    auVar194._0_4_ = fVar212;
                    auVar194._8_4_ = fVar212;
                    auVar194._12_4_ = fVar212;
                    auVar117 = vfmadd132ps_fma(auVar194,auVar214,local_8f0);
                    auVar200._4_4_ = fVar211;
                    auVar200._0_4_ = fVar211;
                    auVar200._8_4_ = fVar211;
                    auVar200._12_4_ = fVar211;
                    auVar117 = vfmadd132ps_fma(auVar200,auVar117,local_8e0);
                    auVar195._4_4_ = fVar172;
                    auVar195._0_4_ = fVar172;
                    auVar195._8_4_ = fVar172;
                    auVar195._12_4_ = fVar172;
                    auVar117 = vfmadd132ps_fma(auVar195,auVar117,auVar7);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar108 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar117._0_4_;
                    uVar234 = vextractps_avx(auVar117,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar234;
                    uVar234 = vextractps_avx(auVar117,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar234;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar206;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar173;
                    *(uint *)(ray + k * 4 + 0x440) = uVar14;
                    *(uint *)(ray + k * 4 + 0x480) = uVar112;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_830 = local_8e0._0_4_;
                    fStack_82c = local_8e0._4_4_;
                    fStack_828 = local_8e0._8_4_;
                    fStack_824 = local_8e0._12_4_;
                    local_910 = local_8f0;
                    local_4b0 = local_8d0;
                    uStack_4a8 = uStack_8c8;
                    local_4a0 = vmovdqa64_avx512vl(auVar250._0_32_);
                    local_6a0 = local_8a0;
                    local_660 = local_8c0;
                    local_63c = iVar15;
                    bVar114 = local_5f0;
                    do {
                      auVar243 = auVar244._0_16_;
                      local_820 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5e0[uVar108]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_5c0 + uVar108 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_5a0 + uVar108 * 4);
                      local_948.context = context->user;
                      fVar212 = local_200._0_4_;
                      fVar172 = 1.0 - fVar212;
                      fVar206 = fVar172 * fVar172 * -3.0;
                      auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar172 * fVar172)),
                                                 ZEXT416((uint)(fVar212 * fVar172)),
                                                 ZEXT416(0xc0000000));
                      auVar118 = vfmsub132ss_fma(ZEXT416((uint)(fVar212 * fVar172)),
                                                 ZEXT416((uint)(fVar212 * fVar212)),
                                                 ZEXT416(0x40000000));
                      fVar172 = auVar117._0_4_ * 3.0;
                      fVar211 = auVar118._0_4_ * 3.0;
                      fVar212 = fVar212 * fVar212 * 3.0;
                      auVar215._0_4_ = fVar212 * (float)local_4b0;
                      auVar215._4_4_ = fVar212 * local_4b0._4_4_;
                      auVar215._8_4_ = fVar212 * (float)uStack_4a8;
                      auVar215._12_4_ = fVar212 * uStack_4a8._4_4_;
                      auVar176._4_4_ = fVar211;
                      auVar176._0_4_ = fVar211;
                      auVar176._8_4_ = fVar211;
                      auVar176._12_4_ = fVar211;
                      auVar117 = vfmadd132ps_fma(auVar176,auVar215,local_910);
                      auVar201._4_4_ = fVar172;
                      auVar201._0_4_ = fVar172;
                      auVar201._8_4_ = fVar172;
                      auVar201._12_4_ = fVar172;
                      auVar102._4_4_ = fStack_82c;
                      auVar102._0_4_ = local_830;
                      auVar102._8_4_ = fStack_828;
                      auVar102._12_4_ = fStack_824;
                      auVar117 = vfmadd132ps_fma(auVar201,auVar117,auVar102);
                      auVar177._4_4_ = fVar206;
                      auVar177._0_4_ = fVar206;
                      auVar177._8_4_ = fVar206;
                      auVar177._12_4_ = fVar206;
                      auVar117 = vfmadd132ps_fma(auVar177,auVar117,auVar7);
                      auVar241 = vbroadcastss_avx512f(auVar117);
                      auVar162 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar162,ZEXT1664(auVar117));
                      auVar162 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar162,ZEXT1664(auVar117));
                      local_2c0[0] = (RTCHitN)auVar241[0];
                      local_2c0[1] = (RTCHitN)auVar241[1];
                      local_2c0[2] = (RTCHitN)auVar241[2];
                      local_2c0[3] = (RTCHitN)auVar241[3];
                      local_2c0[4] = (RTCHitN)auVar241[4];
                      local_2c0[5] = (RTCHitN)auVar241[5];
                      local_2c0[6] = (RTCHitN)auVar241[6];
                      local_2c0[7] = (RTCHitN)auVar241[7];
                      local_2c0[8] = (RTCHitN)auVar241[8];
                      local_2c0[9] = (RTCHitN)auVar241[9];
                      local_2c0[10] = (RTCHitN)auVar241[10];
                      local_2c0[0xb] = (RTCHitN)auVar241[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar241[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar241[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar241[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar241[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar241[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar241[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar241[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar241[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar241[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar241[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar241[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar241[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar241[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar241[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar241[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar241[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar241[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar241[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar241[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar241[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar241[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar241[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar241[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar241[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar241[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar241[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar241[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar241[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar241[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar241[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar241[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar241[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar241[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar241[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar241[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar241[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar241[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar241[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar241[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar241[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar241[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar241[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar241[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar241[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar241[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar241[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar241[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar241[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar241[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar241[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar241[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar241[0x3f];
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar241 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar241);
                      auVar126 = vpcmpeqd_avx2(auVar241._0_32_,auVar241._0_32_);
                      local_918[3] = auVar126;
                      local_918[2] = auVar126;
                      local_918[1] = auVar126;
                      *local_918 = auVar126;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_948.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_948.context)->instPrimID[0]));
                      local_580 = local_300;
                      local_948.valid = (int *)local_580;
                      local_948.geometryUserPtr = pGVar17->userPtr;
                      local_948.hit = local_2c0;
                      local_948.N = 0x10;
                      local_900 = (uint)bVar114;
                      local_948.ray = (RTCRayN *)ray;
                      if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar17->intersectionFilterN)(&local_948);
                        auVar126 = vmovdqa64_avx512vl(local_4a0);
                        auVar250 = ZEXT3264(auVar126);
                        auVar249 = ZEXT3264(local_740);
                        auVar187 = ZEXT3264(local_720);
                        auVar248 = ZEXT3264(local_7c0);
                        auVar247 = ZEXT3264(local_7a0);
                        auVar246 = ZEXT3264(local_700);
                        auVar245 = ZEXT3264(local_780);
                        auVar236 = ZEXT3264(local_6e0);
                        auVar242 = ZEXT3264(local_760);
                        auVar117 = vxorps_avx512vl(auVar243,auVar243);
                        auVar244 = ZEXT1664(auVar117);
                      }
                      bVar107 = (byte)local_900;
                      auVar117 = auVar244._0_16_;
                      auVar241 = vmovdqa64_avx512f(local_580);
                      uVar174 = vptestmd_avx512f(auVar241,auVar241);
                      if ((short)uVar174 == 0) {
LAB_01eeecc2:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_820;
                      }
                      else {
                        p_Var21 = context->args->filter;
                        if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var21)(&local_948);
                          bVar107 = (byte)local_900;
                          auVar126 = vmovdqa64_avx512vl(local_4a0);
                          auVar250 = ZEXT3264(auVar126);
                          auVar249 = ZEXT3264(local_740);
                          auVar187 = ZEXT3264(local_720);
                          auVar248 = ZEXT3264(local_7c0);
                          auVar247 = ZEXT3264(local_7a0);
                          auVar246 = ZEXT3264(local_700);
                          auVar245 = ZEXT3264(local_780);
                          auVar236 = ZEXT3264(local_6e0);
                          auVar242 = ZEXT3264(local_760);
                          auVar117 = vxorps_avx512vl(auVar117,auVar117);
                          auVar244 = ZEXT1664(auVar117);
                        }
                        auVar241 = vmovdqa64_avx512f(local_580);
                        uVar37 = vptestmd_avx512f(auVar241,auVar241);
                        if ((short)uVar37 == 0) goto LAB_01eeecc2;
                        iVar1 = *(int *)(local_948.hit + 4);
                        iVar2 = *(int *)(local_948.hit + 8);
                        iVar88 = *(int *)(local_948.hit + 0xc);
                        iVar89 = *(int *)(local_948.hit + 0x10);
                        iVar90 = *(int *)(local_948.hit + 0x14);
                        iVar91 = *(int *)(local_948.hit + 0x18);
                        iVar92 = *(int *)(local_948.hit + 0x1c);
                        iVar93 = *(int *)(local_948.hit + 0x20);
                        iVar94 = *(int *)(local_948.hit + 0x24);
                        iVar95 = *(int *)(local_948.hit + 0x28);
                        iVar96 = *(int *)(local_948.hit + 0x2c);
                        iVar97 = *(int *)(local_948.hit + 0x30);
                        iVar98 = *(int *)(local_948.hit + 0x34);
                        iVar99 = *(int *)(local_948.hit + 0x38);
                        iVar100 = *(int *)(local_948.hit + 0x3c);
                        bVar114 = (byte)uVar37;
                        bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                        bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                        bVar106 = (byte)(uVar37 >> 8);
                        bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                        bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                        bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                        bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                        bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                        bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                        bVar35 = SUB81(uVar37 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x300) =
                             (uint)(bVar114 & 1) * *(int *)local_948.hit |
                             (uint)!(bool)(bVar114 & 1) * *(int *)(local_948.ray + 0x300);
                        *(uint *)(local_948.ray + 0x304) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 0x304);
                        *(uint *)(local_948.ray + 0x308) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x308);
                        *(uint *)(local_948.ray + 0x30c) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x30c)
                        ;
                        *(uint *)(local_948.ray + 0x310) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x310)
                        ;
                        *(uint *)(local_948.ray + 0x314) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x314)
                        ;
                        *(uint *)(local_948.ray + 0x318) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x318)
                        ;
                        *(uint *)(local_948.ray + 0x31c) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x31c)
                        ;
                        *(uint *)(local_948.ray + 800) =
                             (uint)(bVar106 & 1) * iVar93 |
                             (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 800);
                        *(uint *)(local_948.ray + 0x324) =
                             (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x324)
                        ;
                        *(uint *)(local_948.ray + 0x328) =
                             (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 0x328)
                        ;
                        *(uint *)(local_948.ray + 0x32c) =
                             (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x32c)
                        ;
                        *(uint *)(local_948.ray + 0x330) =
                             (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x330)
                        ;
                        *(uint *)(local_948.ray + 0x334) =
                             (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x334)
                        ;
                        *(uint *)(local_948.ray + 0x338) =
                             (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x338)
                        ;
                        *(uint *)(local_948.ray + 0x33c) =
                             (uint)bVar35 * iVar100 |
                             (uint)!bVar35 * *(int *)(local_948.ray + 0x33c);
                        iVar1 = *(int *)(local_948.hit + 0x44);
                        iVar2 = *(int *)(local_948.hit + 0x48);
                        iVar88 = *(int *)(local_948.hit + 0x4c);
                        iVar89 = *(int *)(local_948.hit + 0x50);
                        iVar90 = *(int *)(local_948.hit + 0x54);
                        iVar91 = *(int *)(local_948.hit + 0x58);
                        iVar92 = *(int *)(local_948.hit + 0x5c);
                        iVar93 = *(int *)(local_948.hit + 0x60);
                        iVar94 = *(int *)(local_948.hit + 100);
                        iVar95 = *(int *)(local_948.hit + 0x68);
                        iVar96 = *(int *)(local_948.hit + 0x6c);
                        iVar97 = *(int *)(local_948.hit + 0x70);
                        iVar98 = *(int *)(local_948.hit + 0x74);
                        iVar99 = *(int *)(local_948.hit + 0x78);
                        iVar100 = *(int *)(local_948.hit + 0x7c);
                        bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                        bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                        bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                        bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                        bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                        bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                        bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                        bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                        bVar35 = SUB81(uVar37 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x340) =
                             (uint)(bVar114 & 1) * *(int *)(local_948.hit + 0x40) |
                             (uint)!(bool)(bVar114 & 1) * *(int *)(local_948.ray + 0x340);
                        *(uint *)(local_948.ray + 0x344) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 0x344);
                        *(uint *)(local_948.ray + 0x348) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x348);
                        *(uint *)(local_948.ray + 0x34c) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x34c)
                        ;
                        *(uint *)(local_948.ray + 0x350) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x350)
                        ;
                        *(uint *)(local_948.ray + 0x354) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x354)
                        ;
                        *(uint *)(local_948.ray + 0x358) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x358)
                        ;
                        *(uint *)(local_948.ray + 0x35c) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x35c)
                        ;
                        *(uint *)(local_948.ray + 0x360) =
                             (uint)(bVar106 & 1) * iVar93 |
                             (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 0x360);
                        *(uint *)(local_948.ray + 0x364) =
                             (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x364)
                        ;
                        *(uint *)(local_948.ray + 0x368) =
                             (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 0x368)
                        ;
                        *(uint *)(local_948.ray + 0x36c) =
                             (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x36c)
                        ;
                        *(uint *)(local_948.ray + 0x370) =
                             (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x370)
                        ;
                        *(uint *)(local_948.ray + 0x374) =
                             (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x374)
                        ;
                        *(uint *)(local_948.ray + 0x378) =
                             (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x378)
                        ;
                        *(uint *)(local_948.ray + 0x37c) =
                             (uint)bVar35 * iVar100 |
                             (uint)!bVar35 * *(int *)(local_948.ray + 0x37c);
                        iVar1 = *(int *)(local_948.hit + 0x84);
                        iVar2 = *(int *)(local_948.hit + 0x88);
                        iVar88 = *(int *)(local_948.hit + 0x8c);
                        iVar89 = *(int *)(local_948.hit + 0x90);
                        iVar90 = *(int *)(local_948.hit + 0x94);
                        iVar91 = *(int *)(local_948.hit + 0x98);
                        iVar92 = *(int *)(local_948.hit + 0x9c);
                        iVar93 = *(int *)(local_948.hit + 0xa0);
                        iVar94 = *(int *)(local_948.hit + 0xa4);
                        iVar95 = *(int *)(local_948.hit + 0xa8);
                        iVar96 = *(int *)(local_948.hit + 0xac);
                        iVar97 = *(int *)(local_948.hit + 0xb0);
                        iVar98 = *(int *)(local_948.hit + 0xb4);
                        iVar99 = *(int *)(local_948.hit + 0xb8);
                        iVar100 = *(int *)(local_948.hit + 0xbc);
                        bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                        bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                        bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                        bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                        bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                        bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                        bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                        bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                        bVar35 = SUB81(uVar37 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x380) =
                             (uint)(bVar114 & 1) * *(int *)(local_948.hit + 0x80) |
                             (uint)!(bool)(bVar114 & 1) * *(int *)(local_948.ray + 0x380);
                        *(uint *)(local_948.ray + 900) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 900);
                        *(uint *)(local_948.ray + 0x388) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x388);
                        *(uint *)(local_948.ray + 0x38c) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x38c)
                        ;
                        *(uint *)(local_948.ray + 0x390) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x390)
                        ;
                        *(uint *)(local_948.ray + 0x394) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x394)
                        ;
                        *(uint *)(local_948.ray + 0x398) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x398)
                        ;
                        *(uint *)(local_948.ray + 0x39c) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x39c)
                        ;
                        *(uint *)(local_948.ray + 0x3a0) =
                             (uint)(bVar106 & 1) * iVar93 |
                             (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 0x3a0);
                        *(uint *)(local_948.ray + 0x3a4) =
                             (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x3a4)
                        ;
                        *(uint *)(local_948.ray + 0x3a8) =
                             (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 0x3a8)
                        ;
                        *(uint *)(local_948.ray + 0x3ac) =
                             (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x3ac)
                        ;
                        *(uint *)(local_948.ray + 0x3b0) =
                             (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x3b0)
                        ;
                        *(uint *)(local_948.ray + 0x3b4) =
                             (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x3b4)
                        ;
                        *(uint *)(local_948.ray + 0x3b8) =
                             (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x3b8)
                        ;
                        *(uint *)(local_948.ray + 0x3bc) =
                             (uint)bVar35 * iVar100 |
                             (uint)!bVar35 * *(int *)(local_948.ray + 0x3bc);
                        iVar1 = *(int *)(local_948.hit + 0xc4);
                        iVar2 = *(int *)(local_948.hit + 200);
                        iVar88 = *(int *)(local_948.hit + 0xcc);
                        iVar89 = *(int *)(local_948.hit + 0xd0);
                        iVar90 = *(int *)(local_948.hit + 0xd4);
                        iVar91 = *(int *)(local_948.hit + 0xd8);
                        iVar92 = *(int *)(local_948.hit + 0xdc);
                        iVar93 = *(int *)(local_948.hit + 0xe0);
                        iVar94 = *(int *)(local_948.hit + 0xe4);
                        iVar95 = *(int *)(local_948.hit + 0xe8);
                        iVar96 = *(int *)(local_948.hit + 0xec);
                        iVar97 = *(int *)(local_948.hit + 0xf0);
                        iVar98 = *(int *)(local_948.hit + 0xf4);
                        iVar99 = *(int *)(local_948.hit + 0xf8);
                        iVar100 = *(int *)(local_948.hit + 0xfc);
                        bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                        bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                        bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                        bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                        bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                        bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                        bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                        bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                        bVar35 = SUB81(uVar37 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x3c0) =
                             (uint)(bVar114 & 1) * *(int *)(local_948.hit + 0xc0) |
                             (uint)!(bool)(bVar114 & 1) * *(int *)(local_948.ray + 0x3c0);
                        *(uint *)(local_948.ray + 0x3c4) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 0x3c4);
                        *(uint *)(local_948.ray + 0x3c8) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x3c8);
                        *(uint *)(local_948.ray + 0x3cc) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x3cc)
                        ;
                        *(uint *)(local_948.ray + 0x3d0) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x3d0)
                        ;
                        *(uint *)(local_948.ray + 0x3d4) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x3d4)
                        ;
                        *(uint *)(local_948.ray + 0x3d8) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x3d8)
                        ;
                        *(uint *)(local_948.ray + 0x3dc) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x3dc)
                        ;
                        *(uint *)(local_948.ray + 0x3e0) =
                             (uint)(bVar106 & 1) * iVar93 |
                             (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 0x3e0);
                        *(uint *)(local_948.ray + 0x3e4) =
                             (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x3e4)
                        ;
                        *(uint *)(local_948.ray + 1000) =
                             (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 1000);
                        *(uint *)(local_948.ray + 0x3ec) =
                             (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x3ec)
                        ;
                        *(uint *)(local_948.ray + 0x3f0) =
                             (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x3f0)
                        ;
                        *(uint *)(local_948.ray + 0x3f4) =
                             (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x3f4)
                        ;
                        *(uint *)(local_948.ray + 0x3f8) =
                             (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x3f8)
                        ;
                        *(uint *)(local_948.ray + 0x3fc) =
                             (uint)bVar35 * iVar100 |
                             (uint)!bVar35 * *(int *)(local_948.ray + 0x3fc);
                        iVar1 = *(int *)(local_948.hit + 0x104);
                        iVar2 = *(int *)(local_948.hit + 0x108);
                        iVar88 = *(int *)(local_948.hit + 0x10c);
                        iVar89 = *(int *)(local_948.hit + 0x110);
                        iVar90 = *(int *)(local_948.hit + 0x114);
                        iVar91 = *(int *)(local_948.hit + 0x118);
                        iVar92 = *(int *)(local_948.hit + 0x11c);
                        iVar93 = *(int *)(local_948.hit + 0x120);
                        iVar94 = *(int *)(local_948.hit + 0x124);
                        iVar95 = *(int *)(local_948.hit + 0x128);
                        iVar96 = *(int *)(local_948.hit + 300);
                        iVar97 = *(int *)(local_948.hit + 0x130);
                        iVar98 = *(int *)(local_948.hit + 0x134);
                        iVar99 = *(int *)(local_948.hit + 0x138);
                        iVar100 = *(int *)(local_948.hit + 0x13c);
                        bVar22 = (bool)((byte)(uVar37 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar37 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar37 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar37 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar37 >> 6) & 1);
                        bVar28 = (bool)((byte)(uVar37 >> 7) & 1);
                        bVar29 = (bool)((byte)(uVar37 >> 9) & 1);
                        bVar30 = (bool)((byte)(uVar37 >> 10) & 1);
                        bVar31 = (bool)((byte)(uVar37 >> 0xb) & 1);
                        bVar32 = (bool)((byte)(uVar37 >> 0xc) & 1);
                        bVar33 = (bool)((byte)(uVar37 >> 0xd) & 1);
                        bVar34 = (bool)((byte)(uVar37 >> 0xe) & 1);
                        bVar35 = SUB81(uVar37 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x400) =
                             (uint)(bVar114 & 1) * *(int *)(local_948.hit + 0x100) |
                             (uint)!(bool)(bVar114 & 1) * *(int *)(local_948.ray + 0x400);
                        *(uint *)(local_948.ray + 0x404) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_948.ray + 0x404);
                        *(uint *)(local_948.ray + 0x408) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_948.ray + 0x408);
                        *(uint *)(local_948.ray + 0x40c) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_948.ray + 0x40c)
                        ;
                        *(uint *)(local_948.ray + 0x410) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_948.ray + 0x410)
                        ;
                        *(uint *)(local_948.ray + 0x414) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_948.ray + 0x414)
                        ;
                        *(uint *)(local_948.ray + 0x418) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_948.ray + 0x418)
                        ;
                        *(uint *)(local_948.ray + 0x41c) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_948.ray + 0x41c)
                        ;
                        *(uint *)(local_948.ray + 0x420) =
                             (uint)(bVar106 & 1) * iVar93 |
                             (uint)!(bool)(bVar106 & 1) * *(int *)(local_948.ray + 0x420);
                        *(uint *)(local_948.ray + 0x424) =
                             (uint)bVar29 * iVar94 | (uint)!bVar29 * *(int *)(local_948.ray + 0x424)
                        ;
                        *(uint *)(local_948.ray + 0x428) =
                             (uint)bVar30 * iVar95 | (uint)!bVar30 * *(int *)(local_948.ray + 0x428)
                        ;
                        *(uint *)(local_948.ray + 0x42c) =
                             (uint)bVar31 * iVar96 | (uint)!bVar31 * *(int *)(local_948.ray + 0x42c)
                        ;
                        *(uint *)(local_948.ray + 0x430) =
                             (uint)bVar32 * iVar97 | (uint)!bVar32 * *(int *)(local_948.ray + 0x430)
                        ;
                        *(uint *)(local_948.ray + 0x434) =
                             (uint)bVar33 * iVar98 | (uint)!bVar33 * *(int *)(local_948.ray + 0x434)
                        ;
                        *(uint *)(local_948.ray + 0x438) =
                             (uint)bVar34 * iVar99 | (uint)!bVar34 * *(int *)(local_948.ray + 0x438)
                        ;
                        *(uint *)(local_948.ray + 0x43c) =
                             (uint)bVar35 * iVar100 |
                             (uint)!bVar35 * *(int *)(local_948.ray + 0x43c);
                        auVar241 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x140));
                        auVar241 = vmovdqu32_avx512f(auVar241);
                        *(undefined1 (*) [64])(local_948.ray + 0x440) = auVar241;
                        auVar241 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x180));
                        auVar241 = vmovdqu32_avx512f(auVar241);
                        *(undefined1 (*) [64])(local_948.ray + 0x480) = auVar241;
                        auVar241 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x1c0));
                        auVar241 = vmovdqa32_avx512f(auVar241);
                        *(undefined1 (*) [64])(local_948.ray + 0x4c0) = auVar241;
                        auVar241 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x200));
                        auVar241 = vmovdqa32_avx512f(auVar241);
                        *(undefined1 (*) [64])(local_948.ray + 0x500) = auVar241;
                      }
                      bVar107 = ~(byte)(1 << ((uint)uVar108 & 0x1f)) & bVar107;
                      uVar173 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar49._4_4_ = uVar173;
                      auVar49._0_4_ = uVar173;
                      auVar49._8_4_ = uVar173;
                      auVar49._12_4_ = uVar173;
                      auVar49._16_4_ = uVar173;
                      auVar49._20_4_ = uVar173;
                      auVar49._24_4_ = uVar173;
                      auVar49._28_4_ = uVar173;
                      uVar174 = vcmpps_avx512vl(local_8c0,auVar49,2);
                      bVar114 = bVar107 & (byte)uVar174;
                      if ((bVar107 & (byte)uVar174) != 0) {
                        auVar185._8_4_ = 0x7f800000;
                        auVar185._0_8_ = 0x7f8000007f800000;
                        auVar185._12_4_ = 0x7f800000;
                        auVar185._16_4_ = 0x7f800000;
                        auVar185._20_4_ = 0x7f800000;
                        auVar185._24_4_ = 0x7f800000;
                        auVar185._28_4_ = 0x7f800000;
                        auVar126 = vblendmps_avx512vl(auVar185,local_8c0);
                        auVar160._0_4_ =
                             (uint)(bVar114 & 1) * auVar126._0_4_ |
                             (uint)!(bool)(bVar114 & 1) * 0x7f800000;
                        bVar22 = (bool)(bVar114 >> 1 & 1);
                        auVar160._4_4_ = (uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar114 >> 2 & 1);
                        auVar160._8_4_ = (uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar114 >> 3 & 1);
                        auVar160._12_4_ =
                             (uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar114 >> 4 & 1);
                        auVar160._16_4_ =
                             (uint)bVar22 * auVar126._16_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar114 >> 5 & 1);
                        auVar160._20_4_ =
                             (uint)bVar22 * auVar126._20_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar114 >> 6 & 1);
                        auVar160._24_4_ =
                             (uint)bVar22 * auVar126._24_4_ | (uint)!bVar22 * 0x7f800000;
                        auVar160._28_4_ =
                             (uint)(bVar114 >> 7) * auVar126._28_4_ |
                             (uint)!(bool)(bVar114 >> 7) * 0x7f800000;
                        auVar126 = vshufps_avx(auVar160,auVar160,0xb1);
                        auVar126 = vminps_avx(auVar160,auVar126);
                        auVar125 = vshufpd_avx(auVar126,auVar126,5);
                        auVar126 = vminps_avx(auVar126,auVar125);
                        auVar125 = vpermpd_avx2(auVar126,0x4e);
                        auVar126 = vminps_avx(auVar126,auVar125);
                        uVar174 = vcmpps_avx512vl(auVar160,auVar126,0);
                        bVar106 = (byte)uVar174 & bVar114;
                        bVar107 = bVar114;
                        if (bVar106 != 0) {
                          bVar107 = bVar106;
                        }
                        uVar38 = 0;
                        for (uVar109 = (uint)bVar107; (uVar109 & 1) == 0;
                            uVar109 = uVar109 >> 1 | 0x80000000) {
                          uVar38 = uVar38 + 1;
                        }
                        uVar108 = (ulong)uVar38;
                      }
                    } while (bVar114 != 0);
                  }
                }
              }
            }
          }
          lVar111 = lVar111 + 8;
          auVar241 = auVar236;
        } while ((int)lVar111 < iVar15);
      }
      uVar173 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar44._4_4_ = uVar173;
      auVar44._0_4_ = uVar173;
      auVar44._8_4_ = uVar173;
      auVar44._12_4_ = uVar173;
      auVar44._16_4_ = uVar173;
      auVar44._20_4_ = uVar173;
      auVar44._24_4_ = uVar173;
      auVar44._28_4_ = uVar173;
      uVar174 = vcmpps_avx512vl(local_320,auVar44,2);
      uVar112 = (uint)uVar110 & (uint)uVar110 + 0xff & (uint)uVar174;
      uVar110 = (ulong)uVar112;
    } while (uVar112 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }